

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O3

int gen_builder_struct_field_assign
              (fb_output_t *out,fb_compound_type_t *ct,int index,int arg_count,int conversion,
              int from_ptr)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  uint16_t uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  enum_entry_t *peVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  fb_scoped_name_t *pfVar11;
  size_t sVar12;
  undefined8 extraout_RAX;
  undefined *puVar13;
  ulong extraout_RAX_00;
  ulong uVar14;
  fb_schema_t *pfVar15;
  entry_t *peVar16;
  entry_t *peVar17;
  entry_t *peVar18;
  dict_entry_t *__base;
  size_t sVar19;
  char *pcVar20;
  fb_scoped_name_t *pfVar21;
  fb_scoped_name_t *pfVar22;
  uint *puVar23;
  undefined8 *puVar24;
  code *pcVar25;
  undefined8 uVar26;
  fb_output_t *pfVar27;
  char *__s;
  undefined8 extraout_RDX;
  fb_symbol_t *pfVar28;
  code *pcVar29;
  uint64_t uVar30;
  long lVar31;
  undefined8 *puVar32;
  fb_symbol_t *pfVar33;
  size_t sVar34;
  char *pcVar35;
  char *pcVar36;
  fb_scoped_name_t *pfVar37;
  FILE *pFVar38;
  undefined1 *puVar39;
  undefined4 in_register_00000084;
  fb_scoped_name_t *pfVar40;
  fb_scoped_name_t *pfVar41;
  undefined4 in_register_0000008c;
  long *plVar42;
  long lVar43;
  uint uVar44;
  char *pcVar45;
  fb_symbol_t *pfVar46;
  fb_compound_type_t *ct_00;
  fb_scoped_name_t *pfVar47;
  bool bVar48;
  undefined4 uVar49;
  undefined8 uStack_a98;
  uint *puStack_a90;
  undefined1 *puStack_a88;
  undefined1 auStack_a78 [24];
  undefined8 uStack_a60;
  fb_scoped_name_t *pfStack_a58;
  fb_scoped_name_t *pfStack_a50;
  fb_output_t *pfStack_9c8;
  ulong uStack_9c0;
  entry_t *peStack_9b8;
  size_t sStack_9b0;
  code *pcStack_9a8;
  byte bStack_999;
  uint uStack_998;
  int iStack_994;
  fb_root_schema_t *pfStack_990;
  size_t sStack_988;
  undefined1 auStack_980 [8];
  gen_match_f *pgStack_978;
  gen_unmatched_f *pgStack_970;
  fb_compound_type_t *pfStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined1 auStack_890 [24];
  object_entry_t *poStack_878;
  enum_entry_t *peStack_870;
  service_entry_t *psStack_868;
  char *pcStack_860;
  object_entry_t *poStack_858;
  enum_entry_t *peStack_850;
  service_entry_t *psStack_848;
  char *pcStack_840;
  fb_schema_t *pfStack_838;
  fb_scoped_name_t *pfStack_7a8;
  undefined8 *puStack_7a0;
  fb_scoped_name_t *pfStack_798;
  fb_scoped_name_t *pfStack_790;
  fb_scoped_name_t *pfStack_788;
  char *pcStack_780;
  fb_scoped_name_t fStack_770;
  fb_scoped_name_t fStack_688;
  fb_output_t *pfStack_5a0;
  fb_scoped_name_t *pfStack_598;
  undefined8 *puStack_590;
  fb_symbol_t *pfStack_588;
  fb_scoped_name_t *pfStack_580;
  fb_scoped_name_t *pfStack_578;
  fb_scoped_name_t *pfStack_570;
  fb_scoped_name_t fStack_568;
  fb_scoped_name_t fStack_480;
  ulong uStack_398;
  fb_scoped_name_t *pfStack_390;
  fb_scoped_name_t *pfStack_388;
  ulong uStack_380;
  fb_scoped_name_t *pfStack_378;
  fb_scoped_name_t *pfStack_370;
  fb_scoped_name_t *pfStack_368;
  undefined8 uStack_360;
  fb_scoped_name_t *pfStack_358;
  fb_scoped_name_t fStack_350;
  fb_scoped_name_t fStack_268;
  fb_output_t *pfStack_180;
  fb_scoped_name_t *pfStack_178;
  char *pcStack_170;
  fb_scoped_name_t *pfStack_168;
  fb_scoped_name_t *pfStack_160;
  fb_scoped_name_t *pfStack_158;
  fb_scoped_name_t *pfStack_150;
  int local_13c;
  fb_scoped_name_t *local_138;
  fb_scoped_name_t *local_130;
  uint local_124;
  int local_120;
  uint local_11c;
  fb_scoped_name_t snref;
  
  pfVar41 = (fb_scoped_name_t *)CONCAT44(in_register_0000008c,from_ptr);
  pfVar37 = (fb_scoped_name_t *)CONCAT44(in_register_00000084,conversion);
  pcVar36 = snref.text;
  pcVar35 = (char *)0x0;
  pfStack_150 = (fb_scoped_name_t *)0x10fb2e;
  local_13c = conversion;
  local_124 = index;
  memset(pcVar36,0,0xe8);
  pcVar20 = "";
  if (arg_count == 1) {
    pcVar20 = "_from_pe";
  }
  pfVar11 = (fb_scoped_name_t *)"_to_pe";
  if (arg_count != 2) {
    pfVar11 = (fb_scoped_name_t *)pcVar20;
  }
  pfVar33 = ct->members;
  local_130 = pfVar11;
  local_120 = arg_count;
  if (pfVar33 != (fb_symbol_t *)0x0) {
    pfVar21 = (fb_scoped_name_t *)0x0;
    pfVar40 = (fb_scoped_name_t *)0x0;
    do {
      pfVar22 = (fb_scoped_name_t *)pfVar33->ident->text;
      local_138 = (fb_scoped_name_t *)(ulong)(uint)pfVar33->ident->len;
      iVar10 = (int)pfVar40;
      if (0 < iVar10) {
        pcVar20 = (char *)out->fp;
        if (((ulong)pfVar40 & 3) == 0) {
          pcVar35 = (char *)0x4;
          pcVar36 = ";\n  ";
        }
        else {
          pcVar35 = &DAT_00000002;
          pcVar36 = "; ";
        }
        pfStack_150 = (fb_scoped_name_t *)0x10fbbe;
        fwrite(pcVar36,(size_t)pcVar35,1,(FILE *)pcVar20);
      }
      uVar2 = pfVar33[1].kind;
      uVar9 = (uint)pfVar21;
      if (0x10 < uVar2) {
        if (uVar2 == 0x11) {
          uVar9 = *(int *)&pfVar33[1].link - 1;
          if (0xb < uVar9) {
            pfStack_150 = (fb_scoped_name_t *)0x110004;
            gen_builder_struct_field_assign_cold_2();
            goto LAB_00110004;
          }
          pcVar36 = (char *)out->fp;
          pcVar20 = pfVar21->text;
          if ((pfVar33[4].kind & 4) != 0) goto LAB_0010fdd7;
          pcVar20 = (&PTR_anon_var_dwarf_4458_00153b30)[uVar9];
          if (local_13c == 0) {
            pcVar35 = "%s%s_array_copy%s(p->%.*s, v%i, %d)";
            pfStack_160 = pfVar40;
            pfStack_158 = (fb_scoped_name_t *)(ulong)*(uint *)&pfVar33[1].field_0x14;
          }
          else {
            pcVar35 = "%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)";
            pfStack_160 = local_138;
            pfStack_158 = pfVar22;
            pfStack_150 = (fb_scoped_name_t *)(ulong)*(uint *)&pfVar33[1].field_0x14;
          }
          pcStack_170 = (char *)0x10fe99;
          pfVar40 = local_130;
          pfVar41 = local_138;
          pfStack_168 = pfVar22;
          uVar9 = fprintf((FILE *)pcVar36,pcVar35,out);
          pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
          goto LAB_0010ff8e;
        }
        if (uVar2 == 0x14) {
          uVar44 = *(uint *)&pfVar33[1].field_0x14;
          pfStack_150 = (fb_scoped_name_t *)0x10fc5e;
          local_11c = uVar9;
          __flatcc_fb_scoped_symbol_name
                    ((fb_scope_t *)pfVar33[1].link[1].link,pfVar33[1].link,&snref);
          pcVar36 = (char *)out->fp;
          if ((pfVar33[4].kind & 4) != 0) {
            pcVar20 = (char *)(ulong)local_11c;
LAB_0010fdd7:
            pfVar40 = pfVar37;
            iVar8 = (int)pcVar20;
            pfStack_150 = (fb_scoped_name_t *)0x10fde1;
            pcVar35 = "__%sstruct_clear_field(p->__deprecated%i)";
            uVar9 = fprintf((FILE *)pcVar36,"__%sstruct_clear_field(p->__deprecated%i)",out);
            pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
            pfVar21 = (fb_scoped_name_t *)(ulong)(iVar8 + 1);
            goto LAB_0010ff8e;
          }
          pcVar20 = local_130->text;
          pfVar37 = local_138;
          if (local_13c == 0) {
            pcVar35 = "%s_array_copy%s(p->%.*s, v%i, %d)";
            pfStack_160 = (fb_scoped_name_t *)0x10fe60;
            pfStack_158 = pfVar40;
            pfStack_150 = (fb_scoped_name_t *)(ulong)uVar44;
            uVar9 = fprintf((FILE *)pcVar36,"%s_array_copy%s(p->%.*s, v%i, %d)",&snref);
            pfVar41 = pfVar22;
          }
          else {
            pcVar35 = "%s_array_copy%s(p->%.*s, p2->%.*s, %d)";
            pfStack_168 = local_138;
            pcStack_170 = (char *)0x10fca4;
            pfStack_160 = pfVar22;
            pfStack_158 = (fb_scoped_name_t *)(ulong)uVar44;
            uVar9 = fprintf((FILE *)pcVar36,"%s_array_copy%s(p->%.*s, p2->%.*s, %d)",&snref);
            pfVar41 = pfVar22;
          }
          pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
          pfVar47 = (fb_scoped_name_t *)(ulong)(iVar10 + 1);
          pfVar40 = (fb_scoped_name_t *)(ulong)local_11c;
          goto LAB_0010ff91;
        }
LAB_00110004:
        pfStack_150 = (fb_scoped_name_t *)0x110009;
        gen_builder_struct_field_assign_cold_3();
LAB_00110009:
        pfStack_150 = (fb_scoped_name_t *)print_literal;
        gen_builder_struct_field_assign_cold_1();
        puVar23 = &switchD_0011002d::switchdataD_001347d8;
        iVar10 = (int)pcVar36;
        switch(*(undefined2 *)(((fb_scoped_name_t *)pcVar35)->text + 0x10)) {
        case 4:
          uVar49 = SUB84(*(double *)((fb_scoped_name_t *)pcVar35)->text,0);
          if (iVar10 == 0xb) {
            uVar49 = SUB84((double)(float)*(double *)((fb_scoped_name_t *)pcVar35)->text,0);
            pcVar36 = "%#.9gf";
          }
          else {
            pcVar36 = "%#.17g";
          }
          iVar10 = sprintf(__s,pcVar36,uVar49);
          return iVar10;
        case 5:
          uVar9 = iVar10 - 1;
          pcVar36 = (char *)(ulong)uVar9;
          pcVar20 = (char *)puVar23;
          if ((uVar9 < 0xc) && ((0x9ffU >> (uVar9 & 0x1f) & 1) != 0)) {
            puVar13 = (&PTR_anon_var_dwarf_40d1_00153b90)[(long)pcVar36];
            uVar26 = *(undefined8 *)((fb_scoped_name_t *)pcVar35)->text;
            pcVar36 = "%s(%ld)";
LAB_001100e1:
            iVar10 = sprintf(__s,pcVar36,puVar13,uVar26,extraout_RAX);
            return iVar10;
          }
          goto LAB_0011010c;
        case 6:
          uVar9 = iVar10 - 1;
          pcVar36 = (char *)(ulong)uVar9;
          if ((uVar9 < 0xc) && ((0x9ffU >> (uVar9 & 0x1f) & 1) != 0)) {
            puVar13 = (&PTR_anon_var_dwarf_40d1_00153b90)[(long)pcVar36];
            uVar26 = *(undefined8 *)((fb_scoped_name_t *)pcVar35)->text;
            pcVar36 = "%s(%lu)";
            goto LAB_001100e1;
          }
          pfStack_158 = (fb_scoped_name_t *)0x110107;
          print_literal_cold_3();
          break;
        case 7:
          uVar9 = iVar10 - 1;
          pcVar36 = (char *)(ulong)uVar9;
          if ((uVar9 < 0xc) && ((0x9ffU >> (uVar9 & 0x1f) & 1) != 0)) {
            iVar10 = sprintf(__s,"%s(%u)",(&PTR_anon_var_dwarf_40d1_00153b90)[(long)pcVar36],
                             (ulong)(byte)((fb_scoped_name_t *)pcVar35)->text[0],extraout_RAX);
            return iVar10;
          }
          break;
        default:
          goto switchD_0011002d_default;
        }
        pfStack_158 = (fb_scoped_name_t *)0x11010c;
        print_literal_cold_1();
        pcVar20 = (char *)puVar23;
LAB_0011010c:
        pfStack_158 = (fb_scoped_name_t *)0x110111;
        print_literal_cold_2();
switchD_0011002d_default:
        pfStack_158 = (fb_scoped_name_t *)gen_union_fields;
        print_literal_cold_4();
        pcStack_170 = "__%sstruct_clear_field(p->__deprecated%i)";
        pcVar45 = "vector_value";
        if ((int)pfVar41 == 0) {
          pcVar45 = "value";
        }
        pfStack_370 = (fb_scoped_name_t *)0x110164;
        pfVar11 = pfVar37;
        pfStack_368 = (fb_scoped_name_t *)pcVar35;
        uStack_360 = extraout_RDX;
        pfStack_358 = (fb_scoped_name_t *)pcVar20;
        pfStack_180 = out;
        pfStack_178 = pfVar22;
        pfStack_168 = pfVar21;
        pfStack_160 = pfVar40;
        pfStack_158 = (fb_scoped_name_t *)pfVar33;
        memset(&fStack_350,0,0xe8);
        pfStack_370 = (fb_scoped_name_t *)0x110178;
        memset(&fStack_268,0,0xe8);
        pfVar27 = *(fb_output_t **)(pfVar37->text + 0x18);
        pfStack_370 = (fb_scoped_name_t *)0x110187;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar27,(fb_symbol_t *)pfVar37,&fStack_350);
        puVar32 = *(undefined8 **)(pfVar37->text + 0x28);
        uVar14 = extraout_RAX_00;
        goto LAB_0011018b;
      }
      if (uVar2 == 9) {
        uVar9 = *(int *)&pfVar33[1].link - 1;
        if (0xb < uVar9) goto LAB_00110009;
        if ((pfVar33[4].kind & 4) != 0) {
LAB_0010fdba:
          pcVar36 = (char *)out->fp;
          pcVar20 = pfVar21->text;
          goto LAB_0010fdd7;
        }
        pcVar20 = (&PTR_anon_var_dwarf_4458_00153b30)[uVar9];
        iVar8 = local_120;
        if (pfVar33[5].ident == (fb_token_t *)&DAT_00000001) {
          iVar8 = 0;
        }
        pcVar36 = (char *)out->fp;
        pfVar27 = out;
        if (iVar8 == 2) {
          if (local_13c == 0) {
            pcVar35 = "%s%s_assign_to_pe(&p->%.*s, v%i)";
            pfStack_158 = pfVar40;
          }
          else {
            pcVar35 = "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)";
LAB_0010feb7:
            pfStack_158 = local_138;
            pfStack_150 = pfVar22;
          }
        }
        else {
          if (iVar8 != 1) {
LAB_0010fe10:
            if (local_13c == 0) {
              pcVar35 = "p->%.*s = v%i";
              pfStack_150 = (fb_scoped_name_t *)0x10ff2f;
              uVar9 = fprintf((FILE *)pcVar36,"p->%.*s = v%i",local_138);
              pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
              pcVar20 = pfVar22->text;
            }
            else {
              pcVar35 = "p->%.*s = p2->%.*s";
              pfVar40 = (fb_scoped_name_t *)((ulong)local_138 & 0xffffffff);
              pfStack_150 = (fb_scoped_name_t *)0x10fe37;
              pfVar41 = pfVar22;
              uVar9 = fprintf((FILE *)pcVar36,"p->%.*s = p2->%.*s");
              pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
              pcVar20 = pfVar22->text;
            }
            goto LAB_0010ff8e;
          }
          if (local_13c != 0) {
            pcVar35 = "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)";
            goto LAB_0010feb7;
          }
          pcVar35 = "%s%s_assign_from_pe(&p->%.*s, v%i)";
          pfStack_158 = pfVar40;
        }
        pfStack_160 = (fb_scoped_name_t *)0x10ff8a;
        pfVar37 = local_138;
        pfVar41 = pfVar22;
        uVar9 = fprintf((FILE *)pcVar36,pcVar35,pfVar27);
        pfVar22 = pfVar37;
      }
      else {
        if (uVar2 != 0xf) goto LAB_00110004;
        pfStack_150 = (fb_scoped_name_t *)0x10fbeb;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar33[1].link[1].link,pfVar33[1].link,&snref)
        ;
        if ((pfVar33[1].link)->kind == 1) {
          pcVar36 = (char *)out->fp;
          if ((pfVar33[4].kind & 4) == 0) {
            if (local_13c != 0) {
              pcVar35 = "%s_copy%s(&p->%.*s, &p2->%.*s)";
              pcVar20 = local_130->text;
              pfVar27 = (fb_output_t *)&snref;
              goto LAB_0010feb7;
            }
            pfStack_150 = (fb_scoped_name_t *)0x10feea;
            fprintf((FILE *)pcVar36,"%s_assign%s(&p->%.*s",&snref,local_130);
            pcVar20 = (char *)(ulong)local_124;
            pfVar37 = (fb_scoped_name_t *)0x0;
            pfStack_150 = (fb_scoped_name_t *)0x10ff00;
            uVar9 = gen_builder_struct_call_list
                              (out,(fb_compound_type_t *)pfVar33[1].link,iVar10,local_124,0);
            pfVar47 = (fb_scoped_name_t *)(ulong)uVar9;
            pcVar35 = (char *)out->fp;
            pcVar36 = (char *)0x29;
            pfStack_150 = (fb_scoped_name_t *)0x10ff14;
            uVar9 = fputc(0x29,(FILE *)pcVar35);
            pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
            pfVar41 = pfVar22;
            pfVar40 = pfVar21;
          }
          else {
            pfStack_150 = (fb_scoped_name_t *)0x10fdf9;
            pcVar35 = "__%sstruct_clear_field(p->__deprecated%i)";
            fprintf((FILE *)pcVar36,"__%sstruct_clear_field(p->__deprecated%i)",out);
            pfVar40 = (fb_scoped_name_t *)(ulong)(uVar9 + 1);
            pcVar36 = (char *)pfVar33[1].link;
            pfStack_150 = (fb_scoped_name_t *)0x10fe05;
            iVar8 = get_total_struct_field_count((fb_compound_type_t *)pcVar36);
            pfVar11 = (fb_scoped_name_t *)(ulong)(uint)(iVar8 + iVar10);
            pfVar47 = (fb_scoped_name_t *)(ulong)(uint)(iVar8 + iVar10);
            pcVar20 = pfVar21->text;
          }
          goto LAB_0010ff91;
        }
        if ((pfVar33[4].kind & 4) != 0) goto LAB_0010fdba;
        iVar8 = local_120;
        if (pfVar33[5].ident == (fb_token_t *)&DAT_00000001) {
          iVar8 = 0;
        }
        pcVar36 = (char *)out->fp;
        pcVar20 = local_138->text;
        if (iVar8 == 2) {
          if (local_13c == 0) {
            pcVar35 = "%s%s_assign_to_pe(&p->%.*s, v%i)";
LAB_0010ffb0:
            pcVar35 = pcVar35 + 2;
            pfStack_150 = (fb_scoped_name_t *)0x10ffc7;
            pfVar41 = pfVar40;
            uVar9 = fprintf((FILE *)pcVar36,pcVar35,&snref);
            pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
            pfVar40 = pfVar22;
            goto LAB_0010ff8e;
          }
          pcVar35 = "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)";
        }
        else {
          if (iVar8 != 1) goto LAB_0010fe10;
          if (local_13c == 0) {
            pcVar35 = "%s%s_assign_from_pe(&p->%.*s, v%i)";
            goto LAB_0010ffb0;
          }
          pcVar35 = "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)";
        }
        pcVar35 = pcVar35 + 2;
        pfVar41 = (fb_scoped_name_t *)((ulong)local_138 & 0xffffffff);
        pfStack_160 = (fb_scoped_name_t *)0x10ff5c;
        pfStack_158 = pfVar22;
        uVar9 = fprintf((FILE *)pcVar36,pcVar35,&snref);
      }
      pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
      pfVar40 = pfVar22;
LAB_0010ff8e:
      pfVar47 = (fb_scoped_name_t *)(ulong)(iVar10 + 1);
      pfVar37 = pfVar40;
      pfVar40 = pfVar21;
LAB_0010ff91:
      pfVar33 = pfVar33->link;
      pfVar21 = pfVar40;
      pfVar40 = pfVar47;
    } while (pfVar33 != (fb_symbol_t *)0x0);
  }
  iVar10 = (int)pfVar11;
  if (0 < (int)local_124) {
    pfStack_150 = (fb_scoped_name_t *)0x10ffed;
    sVar12 = fwrite(";\n  ",4,1,(FILE *)out->fp);
    iVar10 = (int)sVar12;
  }
  return iVar10;
LAB_0011018b:
  if (puVar32 == (undefined8 *)0x0) {
    return (int)uVar14;
  }
  uVar2 = *(ushort *)(puVar32 + 5);
  uVar14 = (ulong)uVar2;
  if (uVar2 == 0) goto LAB_0011026f;
  uVar26 = *(undefined8 *)puVar32[1];
  uVar14 = (ulong)*(uint *)((undefined8 *)puVar32[1] + 1);
  if (uVar2 == 0xb) {
    pfVar27 = (fb_output_t *)((fb_scoped_name_t *)pcVar36)->scope;
    pcVar20 = "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n";
LAB_00110254:
    pfStack_388 = &fStack_350;
    pfStack_390 = pfStack_358;
    uStack_398 = uStack_360;
    fStack_480.total_len = 0x11026b;
    fStack_480._228_4_ = 0;
    pfVar11 = (fb_scoped_name_t *)pcVar36;
    pfVar41 = pfStack_368;
    uStack_380 = uVar14;
    pfStack_378 = (fb_scoped_name_t *)uVar26;
    uVar9 = fprintf((FILE *)pfVar27,pcVar20,pcVar36,pcVar45);
    uVar14 = (ulong)uVar9;
    goto LAB_0011026f;
  }
  if (uVar2 == 0xf) {
    pfVar27 = (fb_output_t *)((fb_symbol_t *)puVar32[3])[1].link;
    pfStack_370 = (fb_scoped_name_t *)0x1101d0;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar27,(fb_symbol_t *)puVar32[3],&fStack_268);
    if (*(short *)(puVar32[3] + 0x10) == 1) {
      pfVar27 = (fb_output_t *)((fb_scoped_name_t *)pcVar36)->scope;
      pcVar20 = "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_370 = &fStack_268;
    }
    else {
      if (*(short *)(puVar32[3] + 0x10) != 0) goto LAB_0011028f;
      pfVar27 = (fb_output_t *)((fb_scoped_name_t *)pcVar36)->scope;
      pcVar20 = "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_370 = &fStack_268;
    }
    goto LAB_00110254;
  }
  pfStack_370 = (fb_scoped_name_t *)0x11028f;
  gen_union_fields_cold_2();
LAB_0011028f:
  pfStack_370 = (fb_scoped_name_t *)__flatcc_fb_gen_c_verifier;
  gen_union_fields_cold_1();
  pfStack_578 = (fb_scoped_name_t *)0x1102ce;
  uStack_398 = uVar14;
  pfStack_390 = (fb_scoped_name_t *)pcVar36;
  pfStack_388 = (fb_scoped_name_t *)pcVar45;
  uStack_380 = uVar26;
  pfStack_378 = &fStack_268;
  pfStack_370 = (fb_scoped_name_t *)puVar32;
  fprintf((FILE *)pfVar27->fp,"#ifndef %s_VERIFIER_H\n#define %s_VERIFIER_H\n",
          pfVar27->S->basenameup);
  pfStack_578 = (fb_scoped_name_t *)0x1102eb;
  fwrite("\n/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */\n\n",0x51
         ,1,(FILE *)pfVar27->fp);
  pfStack_578 = (fb_scoped_name_t *)0x11030e;
  fprintf((FILE *)pfVar27->fp,"#ifndef %s_READER_H\n",pfVar27->S->basenameup);
  pfStack_578 = (fb_scoped_name_t *)0x110331;
  fprintf((FILE *)pfVar27->fp,"#include \"%s_reader.h\"\n",pfVar27->S->basename);
  pfStack_578 = (fb_scoped_name_t *)0x11034e;
  fwrite("#endif\n",7,1,(FILE *)pfVar27->fp);
  pfStack_578 = (fb_scoped_name_t *)0x11036b;
  fwrite("#include \"flatcc/flatcc_verifier.h\"\n",0x24,1,(FILE *)pfVar27->fp);
  pfStack_578 = (fb_scoped_name_t *)0x110381;
  __flatcc_fb_gen_c_includes(pfVar27,"_verifier.h","_VERIFIER_H");
  if (pfVar27->opts->cgen_pragmas != 0) {
    pfStack_578 = (fb_scoped_name_t *)0x1103ae;
    fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,(FILE *)pfVar27->fp);
  }
  pfStack_578 = (fb_scoped_name_t *)0x1103bf;
  fputc(10,(FILE *)pfVar27->fp);
  pfStack_578 = (fb_scoped_name_t *)0x1103d0;
  memset(&fStack_568,0,0xe8);
  pfVar33 = pfVar27->S->symbols;
  if (pfVar33 != (fb_symbol_t *)0x0) {
    do {
      if (pfVar33->kind == 0) {
        pfStack_578 = (fb_scoped_name_t *)0x110403;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar33[1].link,pfVar33,&fStack_568);
        pfStack_578 = (fb_scoped_name_t *)0x110417;
        fprintf((FILE *)pfVar27->fp,
                "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td);\n",&fStack_568)
        ;
      }
      pfVar33 = pfVar33->link;
    } while (pfVar33 != (fb_symbol_t *)0x0);
  }
  pfStack_578 = (fb_scoped_name_t *)0x110430;
  fputc(10,(FILE *)pfVar27->fp);
  pfVar33 = pfVar27->S->symbols;
  if (pfVar33 == (fb_symbol_t *)0x0) goto LAB_00110ba0;
  do {
    if (pfVar33->kind == 4) {
      pfStack_578 = (fb_scoped_name_t *)0x11046c;
      memset(&fStack_568,0,0xe8);
      pfStack_578 = (fb_scoped_name_t *)0x11047b;
      memset(&fStack_480,0,0xe8);
      pfStack_578 = (fb_scoped_name_t *)0x11048a;
      __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar33[1].link,pfVar33,&fStack_568);
      pfVar37 = (fb_scoped_name_t *)pfVar27->fp;
      pfStack_578 = (fb_scoped_name_t *)0x1104a2;
      fprintf((FILE *)pfVar37,
              "static int %s_union_verifier(flatcc_union_verifier_descriptor_t *ud)\n{\n    switch (ud->type) {\n"
              ,&fStack_568);
      for (puVar32 = *(undefined8 **)&pfVar33[1].kind; puVar32 != (undefined8 *)0x0;
          puVar32 = (undefined8 *)*puVar32) {
        sVar3 = *(short *)(puVar32 + 5);
        pfVar40 = pfVar11;
        if (sVar3 != 0) {
          pfVar40 = *(fb_scoped_name_t **)puVar32[1];
          uVar9 = *(uint *)((undefined8 *)puVar32[1] + 1);
          pfVar21 = (fb_scoped_name_t *)(ulong)uVar9;
          if (sVar3 == 0xb) {
            pfVar37 = (fb_scoped_name_t *)pfVar27->fp;
            pfStack_578 = (fb_scoped_name_t *)0x11053b;
            fprintf((FILE *)pfVar37,
                    "    case %u: return flatcc_verify_union_string(ud); /* %.*s */\n",
                    (ulong)*(uint *)(puVar32 + 9),pfVar21);
          }
          else {
            if (sVar3 != 0xf) {
              pfStack_578 = (fb_scoped_name_t *)0x110c09;
              __flatcc_fb_gen_c_verifier_cold_2();
LAB_00110c09:
              pfStack_578 = (fb_scoped_name_t *)0x110c0e;
              __flatcc_fb_gen_c_verifier_cold_1();
              goto switchD_001108d3_caseD_2;
            }
            pfVar37 = (fb_scoped_name_t *)((fb_symbol_t *)puVar32[3])[1].link;
            pfStack_578 = (fb_scoped_name_t *)0x1104e4;
            __flatcc_fb_scoped_symbol_name
                      ((fb_scope_t *)pfVar37,(fb_symbol_t *)puVar32[3],&fStack_480);
            lVar43 = puVar32[3];
            if (*(short *)(lVar43 + 0x10) == 1) {
              pfVar37 = (fb_scoped_name_t *)pfVar27->fp;
              pfVar41 = (fb_scoped_name_t *)(ulong)*(ushort *)(lVar43 + 0xb8);
              pfStack_578 = (fb_scoped_name_t *)0x11056c;
              pfStack_570 = pfVar40;
              fprintf((FILE *)pfVar37,
                      "    case %u: return flatcc_verify_union_struct(ud, %lu, %u); /* %.*s */\n",
                      (ulong)*(uint *)(puVar32 + 9),*(undefined8 *)(lVar43 + 0xc0));
              pfVar40 = pfVar41;
              pfVar41 = pfVar21;
            }
            else {
              if (*(short *)(lVar43 + 0x10) != 0) goto LAB_00110c09;
              pfVar37 = (fb_scoped_name_t *)pfVar27->fp;
              pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
              pfStack_578 = (fb_scoped_name_t *)0x11051b;
              pfVar41 = pfVar40;
              fprintf((FILE *)pfVar37,
                      "    case %u: return flatcc_verify_union_table(ud, %s_verify_table); /* %.*s */\n"
                      ,(ulong)*(uint *)(puVar32 + 9),&fStack_480);
              pfVar40 = pfVar11;
            }
          }
        }
        pfVar11 = pfVar40;
      }
      pfStack_578 = (fb_scoped_name_t *)0x110592;
      fwrite("    default: return flatcc_verify_ok;\n    }\n}\n\n",0x2f,1,(FILE *)pfVar27->fp);
    }
    pfVar33 = pfVar33->link;
  } while (pfVar33 != (fb_symbol_t *)0x0);
  pfVar33 = pfVar27->S->symbols;
  if (pfVar33 == (fb_symbol_t *)0x0) goto LAB_00110ba0;
  do {
    if (pfVar33->kind == 1) {
      pfStack_578 = (fb_scoped_name_t *)0x1105e7;
      memset(&fStack_568,0,0xe8);
      pfStack_578 = (fb_scoped_name_t *)0x1105f6;
      __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar33[1].link,pfVar33,&fStack_568);
      pfStack_578 = (fb_scoped_name_t *)0x110620;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
              ,&fStack_568,&fStack_568,pfVar33[8].link,(ulong)pfVar33[7].kind);
      pfStack_578 = (fb_scoped_name_t *)0x11064a;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
              ,&fStack_568,&fStack_568,pfVar33[8].link,(ulong)pfVar33[7].kind);
      pfStack_578 = (fb_scoped_name_t *)0x110674;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
              ,&fStack_568,&fStack_568,pfVar33[8].link,(ulong)pfVar33[7].kind);
      pfStack_578 = (fb_scoped_name_t *)0x11069e;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
              ,&fStack_568,&fStack_568,pfVar33[8].link,(ulong)pfVar33[7].kind);
      pfStack_578 = (fb_scoped_name_t *)0x1106c8;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, thash, %lu, %u);\n}\n\n"
              ,&fStack_568,pfVar27,pfVar33[8].link,(ulong)pfVar33[7].kind);
      pfVar41 = (fb_scoped_name_t *)(ulong)pfVar33[7].kind;
      pfStack_578 = (fb_scoped_name_t *)0x1106ee;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, thash, %lu, %u);\n}\n\n"
              ,&fStack_568,pfVar27,pfVar33[8].link);
      pfStack_578 = (fb_scoped_name_t *)0x110711;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, fid, %lu, %u);\n}\n\n"
              ,&fStack_568,pfVar33[8].link,(ulong)pfVar33[7].kind);
      pfVar11 = (fb_scoped_name_t *)(ulong)pfVar33[7].kind;
      pfStack_578 = (fb_scoped_name_t *)0x110734;
      fprintf((FILE *)pfVar27->fp,
              "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, fid, %lu, %u);\n}\n\n"
              ,&fStack_568,pfVar33[8].link);
    }
    pfVar33 = pfVar33->link;
  } while (pfVar33 != (fb_symbol_t *)0x0);
  pfVar33 = pfVar27->S->symbols;
  if (pfVar33 == (fb_symbol_t *)0x0) goto LAB_00110ba0;
  pfVar40 = &fStack_568;
LAB_00110761:
  if (pfVar33->kind != 0) goto LAB_00110b94;
  pfStack_578 = (fb_scoped_name_t *)0x11077c;
  memset(pfVar40,0,0xe8);
  pfStack_578 = (fb_scoped_name_t *)0x11078b;
  memset(&fStack_480,0,0xe8);
  pfStack_578 = (fb_scoped_name_t *)0x11079a;
  __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar33[1].link,pfVar33,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x1107b2;
  fprintf((FILE *)pfVar27->fp,
          "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td)\n{\n",pfVar40);
  puVar32 = *(undefined8 **)&pfVar33[1].kind;
  if (puVar32 == (undefined8 *)0x0) goto LAB_00110a70;
  bVar48 = false;
LAB_001107c1:
  if ((*(byte *)(puVar32 + 0xe) & 4) != 0) goto code_r0x001107c8;
  if (bVar48) {
    sVar12 = 0x1e;
    pcVar36 = ")) return ret;\n    if ((ret = ";
  }
  else {
    sVar12 = 0x1c;
    pcVar36 = "    int ret;\n    if ((ret = ";
  }
  pfStack_578 = (fb_scoped_name_t *)0x11080a;
  fwrite(pcVar36,sVar12,1,(FILE *)pfVar27->fp);
  if (8 < *(ushort *)(puVar32 + 5) - 8) goto switchD_00110833_caseD_c;
  pfVar21 = (fb_scoped_name_t *)(ulong)(*(uint *)(puVar32 + 0xe) >> 8 & 1);
  switch((uint)*(ushort *)(puVar32 + 5)) {
  case 8:
    pfVar46 = (fb_symbol_t *)puVar32[0x12];
    if (pfVar46 == (fb_symbol_t *)0x0) {
switchD_001108d3_caseD_1:
      pFVar38 = (FILE *)pfVar27->fp;
      pfVar11 = (fb_scoped_name_t *)puVar32[0x10];
      uVar26 = puVar32[0x11];
      uVar2 = *(ushort *)((long)puVar32 + 0x72);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pfVar11->text + (pfVar11 == (fb_scoped_name_t *)0x0);
      pfStack_570 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar6,0);
      pcVar36 = "flatcc_verify_vector_field(td, %lu, %d, %lu, %u, INT64_C(%lu))";
    }
    else {
      pfStack_578 = (fb_scoped_name_t *)0x110851;
      __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar46[1].link,pfVar46,&fStack_480);
      uVar26 = puVar32[0x11];
      pFVar38 = (FILE *)pfVar27->fp;
      if (*(short *)(puVar32[0x12] + 0x10) == 0) {
        pfVar11 = (fb_scoped_name_t *)(ulong)*(ushort *)((long)puVar32 + 0x72);
        pfStack_578 = (fb_scoped_name_t *)0x110a4d;
        pfVar41 = &fStack_480;
        fprintf(pFVar38,"flatcc_verify_table_as_nested_root(td, %lu, %u, 0, %u, %s_verify_table)",
                uVar26,pfVar21);
        break;
      }
      pfVar11 = (fb_scoped_name_t *)puVar32[0x10];
      uVar2 = *(ushort *)((long)puVar32 + 0x72);
      pcVar36 = "flatcc_verify_struct_as_nested_root(td, %lu, %u, 0, %lu,  %u)";
    }
    pfVar41 = (fb_scoped_name_t *)(ulong)uVar2;
    pfStack_578 = (fb_scoped_name_t *)0x11091b;
    fprintf(pFVar38,pcVar36,uVar26,pfVar21);
    break;
  case 9:
switchD_00110833_caseD_9:
    pfVar11 = (fb_scoped_name_t *)(ulong)*(ushort *)((long)puVar32 + 0x72);
    pfStack_578 = (fb_scoped_name_t *)0x11099d;
    fprintf((FILE *)pfVar27->fp,"flatcc_verify_field(td, %lu, %lu, %u)",puVar32[0x11],puVar32[0x10])
    ;
    break;
  case 10:
    pFVar38 = (FILE *)pfVar27->fp;
    uVar26 = puVar32[0x11];
    pcVar36 = "flatcc_verify_string_vector_field(td, %lu, %d)";
    goto LAB_00110935;
  case 0xb:
    pFVar38 = (FILE *)pfVar27->fp;
    uVar26 = puVar32[0x11];
    pcVar36 = "flatcc_verify_string_field(td, %lu, %d)";
LAB_00110935:
    pfStack_578 = (fb_scoped_name_t *)0x11093e;
    fprintf(pFVar38,pcVar36,uVar26,pfVar21);
    break;
  case 0xf:
    pfVar37 = (fb_scoped_name_t *)((fb_symbol_t *)puVar32[3])[1].link;
    pfStack_578 = (fb_scoped_name_t *)0x110953;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar37,(fb_symbol_t *)puVar32[3],&fStack_480);
    switch(*(undefined2 *)(puVar32[3] + 0x10)) {
    case 0:
      pFVar38 = (FILE *)pfVar27->fp;
      uVar26 = puVar32[0x11];
      pcVar36 = "flatcc_verify_table_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_00110833_caseD_9;
    default:
      goto switchD_00110973_caseD_2;
    case 4:
      pFVar38 = (FILE *)pfVar27->fp;
      uVar26 = puVar32[0x11];
      pcVar36 = "flatcc_verify_union_field(td, %lu, %d, &%s_union_verifier)";
    }
    goto LAB_001109f9;
  case 0x10:
    pfVar37 = (fb_scoped_name_t *)((fb_symbol_t *)puVar32[3])[1].link;
    pfStack_578 = (fb_scoped_name_t *)0x1108b3;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar37,(fb_symbol_t *)puVar32[3],&fStack_480);
    switch(*(undefined2 *)(puVar32[3] + 0x10)) {
    case 0:
      pFVar38 = (FILE *)pfVar27->fp;
      uVar26 = puVar32[0x11];
      pcVar36 = "flatcc_verify_table_vector_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_001108d3_caseD_1;
    default:
      goto switchD_001108d3_caseD_2;
    case 4:
      pFVar38 = (FILE *)pfVar27->fp;
      uVar26 = puVar32[0x11];
      pcVar36 = "flatcc_verify_union_vector_field(td, %lu, %d, &%s_union_verifier)";
    }
LAB_001109f9:
    pfStack_578 = (fb_scoped_name_t *)0x110a05;
    pfVar11 = &fStack_480;
    fprintf(pFVar38,pcVar36,uVar26,pfVar21);
  }
switchD_00110833_caseD_c:
  pfStack_578 = (fb_scoped_name_t *)0x110a24;
  fprintf((FILE *)pfVar27->fp," /* %.*s */",(ulong)*(uint *)((undefined8 *)puVar32[1] + 1),
          *(undefined8 *)puVar32[1]);
  puVar32 = (undefined8 *)*puVar32;
  bVar48 = true;
  if (puVar32 == (undefined8 *)0x0) goto LAB_00110a53;
  goto LAB_001107c1;
LAB_0011026f:
  puVar32 = (undefined8 *)*puVar32;
  goto LAB_0011018b;
code_r0x001107c8:
  puVar32 = (undefined8 *)*puVar32;
  if (puVar32 == (undefined8 *)0x0) goto LAB_00110a4f;
  goto LAB_001107c1;
LAB_00110a4f:
  if (bVar48) {
LAB_00110a53:
    pfStack_578 = (fb_scoped_name_t *)0x110a70;
    fwrite(")) return ret;\n",0xf,1,(FILE *)pfVar27->fp);
  }
LAB_00110a70:
  pfStack_578 = (fb_scoped_name_t *)0x110a8d;
  fwrite("    return flatcc_verify_ok;\n",0x1d,1,(FILE *)pfVar27->fp);
  pfStack_578 = (fb_scoped_name_t *)0x110aaa;
  fwrite("}\n\n",3,1,(FILE *)pfVar27->fp);
  pfStack_578 = (fb_scoped_name_t *)0x110ac8;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar40,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x110ae6;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar40,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x110b04;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar40,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x110b22;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar40,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x110b3d;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x110b58;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x110b76;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar27,pfVar40);
  pfStack_578 = (fb_scoped_name_t *)0x110b94;
  pfVar11 = pfVar40;
  fprintf((FILE *)pfVar27->fp,
          "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root_with_size(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,pfVar40,pfVar27);
LAB_00110b94:
  pfVar33 = pfVar33->link;
  if (pfVar33 == (fb_symbol_t *)0x0) {
LAB_00110ba0:
    if (pfVar27->opts->cgen_pragmas != 0) {
      pfStack_578 = (fb_scoped_name_t *)0x110bcd;
      fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)pfVar27->fp);
    }
    pfStack_578 = (fb_scoped_name_t *)0x110bf0;
    fprintf((FILE *)pfVar27->fp,"#endif /* %s_VERIFIER_H */\n",pfVar27->S->basenameup);
    return 0;
  }
  goto LAB_00110761;
switchD_001108d3_caseD_2:
  pfStack_578 = (fb_scoped_name_t *)0x110c13;
  __flatcc_fb_gen_c_verifier_cold_3();
switchD_00110973_caseD_2:
  pfStack_578 = (fb_scoped_name_t *)__flatcc_fb_gen_c_sorter;
  __flatcc_fb_gen_c_verifier_cold_4();
  pfVar46 = *(fb_symbol_t **)(*(long *)&pfVar37->scope_len + 0x40);
  for (pfVar28 = pfVar46; pfVar28 != (fb_symbol_t *)0x0; pfVar28 = pfVar28->link) {
    if ((pfVar28->kind & 0xfffb) == 0) {
      for (puVar24 = *(undefined8 **)&pfVar28[1].kind; puVar24 != (undefined8 *)0x0;
          puVar24 = (undefined8 *)*puVar24) {
        if ((ushort)((short)*(undefined4 *)(puVar24 + 5) - 0xfU) < 2) {
          *(undefined8 *)(puVar24[3] + 0xd0) = 0;
        }
      }
      pfVar28[8].kind = 0;
      pfVar28[8].flags = 0;
      *(undefined4 *)&pfVar28[8].field_0x14 = 0;
    }
  }
  iVar10 = 0;
  do {
    while (pfStack_5a0 = pfVar27, pfStack_598 = &fStack_480, puStack_590 = puVar32,
          pfStack_588 = pfVar33, pfStack_580 = pfVar40, pfStack_578 = pfVar21,
          pfVar46 == (fb_symbol_t *)0x0) {
      bVar48 = iVar10 == 0;
      iVar10 = 0;
      if (bVar48) {
        pcStack_780 = (char *)0x110d3f;
        memset(&fStack_688,0,0xe8);
LAB_00110da9:
        pcStack_780 = (char *)0x110dba;
        fputc(10,(FILE *)pfVar37->scope);
        pfVar33 = *(fb_symbol_t **)(*(long *)&pfVar37->scope_len + 0x40);
        if (pfVar33 != (fb_symbol_t *)0x0) {
          do {
            if ((pfVar33->kind == 4) && ((pfVar33[8].kind & 3) != 0)) {
              pcStack_780 = (char *)0x110dff;
              memset(&fStack_688,0,0xe8);
              pcStack_780 = (char *)0x110e10;
              memset(&fStack_770,0,0xe8);
              pcStack_780 = (char *)0x110e1f;
              __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar33[1].link,pfVar33,&fStack_688);
              pcStack_780 = (char *)0x110e3d;
              fprintf((FILE *)pfVar37->scope,
                      "static void %s_sort(%s_mutable_union_t u)\n{\n    switch (u.type) {\n",
                      &fStack_688,&fStack_688);
              for (puVar32 = *(undefined8 **)&pfVar33[1].kind; puVar32 != (undefined8 *)0x0;
                  puVar32 = (undefined8 *)*puVar32) {
                if (*(short *)(puVar32 + 5) == 0xf) {
                  pfVar40 = *(fb_scoped_name_t **)puVar32[1];
                  uVar9 = *(uint *)((undefined8 *)puVar32[1] + 1);
                  pcStack_780 = (char *)0x110e6a;
                  __flatcc_fb_scoped_symbol_name
                            ((fb_scope_t *)((fb_symbol_t *)puVar32[3])[1].link,
                             (fb_symbol_t *)puVar32[3],&fStack_770);
                  if ((*(short *)(puVar32[3] + 0x10) == 0) &&
                     ((*(byte *)(puVar32[3] + 0xd0) & 3) != 0)) {
                    pfVar41 = &fStack_770;
                    pcStack_780 = (char *)0x110ea1;
                    fprintf((FILE *)pfVar37->scope,"    case %s_%.*s: %s_sort(u.value); break;\n",
                            &fStack_688,(ulong)uVar9);
                    pfVar11 = pfVar40;
                  }
                }
              }
              pcStack_780 = (char *)0x110ec6;
              fwrite("    default: break;\n    }\n}\n\n",0x1d,1,(FILE *)pfVar37->scope);
            }
            pfVar33 = pfVar33->link;
          } while (pfVar33 != (fb_symbol_t *)0x0);
          pfVar33 = *(fb_symbol_t **)(*(long *)&pfVar37->scope_len + 0x40);
          if (pfVar33 != (fb_symbol_t *)0x0) {
            do {
              if ((pfVar33->kind == 0) && ((pfVar33[8].kind & 3) != 0)) {
                pcStack_780 = (char *)0x110f17;
                memset(&fStack_688,0,0xe8);
                pcStack_780 = (char *)0x110f28;
                memset(&fStack_770,0,0xe8);
                pcStack_780 = (char *)0x110f37;
                __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar33[1].link,pfVar33,&fStack_688);
                pcStack_780 = (char *)0x110f52;
                fprintf((FILE *)pfVar37->scope,"static void %s_sort(%s_mutable_table_t t)\n{\n",
                        &fStack_688,&fStack_688);
                pcVar36 = "    if (!t) return;\n";
                pcStack_780 = (char *)0x110f6f;
                fwrite("    if (!t) return;\n",0x14,1,(FILE *)pfVar37->scope);
                if (((pfVar33[8].kind & 1) != 0) &&
                   (plVar42 = *(long **)&pfVar33[1].kind, plVar42 != (long *)0x0)) {
                  do {
                    if ((*(byte *)(plVar42 + 0xe) & 4) == 0) {
                      pfVar40 = *(fb_scoped_name_t **)plVar42[1];
                      uVar9 = *(uint *)((undefined8 *)plVar42[1] + 1);
                      if ((short)plVar42[5] == 0x10) {
                        pcVar36 = (char *)((fb_symbol_t *)plVar42[3])[1].link;
                        pcStack_780 = (char *)0x111004;
                        __flatcc_fb_scoped_symbol_name
                                  ((fb_scope_t *)pcVar36,(fb_symbol_t *)plVar42[3],&fStack_770);
                        lVar43 = plVar42[3];
                        if (*(short *)(lVar43 + 0x10) == 4) {
                          bVar1 = *(byte *)(lVar43 + 0xd0);
                          pcVar20 = "    __%ssort_union_vector_field_elements(%s, %.*s, %s, t);\n";
                        }
                        else {
                          if (*(short *)(lVar43 + 0x10) != 0) goto LAB_0011104f;
                          bVar1 = *(byte *)(lVar43 + 0xd0);
                          pcVar20 = "    __%ssort_table_vector_field_elements(%s, %.*s, %s, t);\n";
                        }
                      }
                      else {
                        if ((short)plVar42[5] != 0xf) goto LAB_0011104f;
                        pcVar36 = (char *)((fb_symbol_t *)plVar42[3])[1].link;
                        pcStack_780 = (char *)0x110fc9;
                        __flatcc_fb_scoped_symbol_name
                                  ((fb_scope_t *)pcVar36,(fb_symbol_t *)plVar42[3],&fStack_770);
                        lVar43 = plVar42[3];
                        if (*(short *)(lVar43 + 0x10) == 4) {
                          bVar1 = *(byte *)(lVar43 + 0xd0);
                          pcVar20 = "    __%ssort_union_field(%s, %.*s, %s, t);\n";
                        }
                        else {
                          if (*(short *)(lVar43 + 0x10) != 0) goto LAB_0011104f;
                          bVar1 = *(byte *)(lVar43 + 0xd0);
                          pcVar20 = "    __%ssort_table_field(%s, %.*s, %s, t);\n";
                        }
                      }
                      if ((bVar1 & 3) != 0) {
                        pcVar36 = (char *)pfVar37->scope;
                        pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
                        pfStack_788 = &fStack_770;
                        pfStack_790 = (fb_scoped_name_t *)0x11104b;
                        fprintf((FILE *)pcVar36,pcVar20,pfVar37,&fStack_688);
                        pfVar41 = pfVar40;
                      }
                    }
LAB_0011104f:
                    plVar42 = (long *)*plVar42;
                  } while (plVar42 != (long *)0x0);
                  if ((pfVar33[8].kind & 1) != 0) {
                    for (puVar32 = *(undefined8 **)&pfVar33[1].kind; puVar32 != (undefined8 *)0x0;
                        puVar32 = (undefined8 *)*puVar32) {
                      if ((*(byte *)((long)puVar32 + 0x71) & 0x20) != 0) {
                        pfVar40 = *(fb_scoped_name_t **)puVar32[1];
                        uVar9 = *(uint *)((undefined8 *)puVar32[1] + 1);
                        sVar3 = *(short *)(puVar32 + 5);
                        if (sVar3 == 0x10) {
                          pfVar46 = (fb_symbol_t *)puVar32[3];
                          if (pfVar46[2].ident == (fb_token_t *)0x0) {
LAB_001111d1:
                            pcStack_780 = (char *)0x1111d6;
                            __flatcc_fb_gen_c_sorter_cold_1();
                            pcStack_9a8 = (code *)0x111208;
                            pfStack_7a8 = pfVar37;
                            puStack_7a0 = puVar32;
                            pfStack_798 = pfVar40;
                            pfStack_790 = &fStack_688;
                            pfStack_788 = (fb_scoped_name_t *)pfVar33;
                            pcStack_780 = (char *)(ulong)uVar9;
                            println((fb_output_t *)pcVar36,"#ifndef %s_JSON_PARSER_H",
                                    ((fb_output_t *)pcVar36)->S->basenameup);
                            pcStack_9a8 = (code *)0x111227;
                            println((fb_output_t *)pcVar36,"#define %s_JSON_PARSER_H",
                                    ((fb_output_t *)pcVar36)->S->basenameup);
                            pcStack_9a8 = (code *)0x11123b;
                            println((fb_output_t *)pcVar36,"");
                            pcStack_9a8 = (code *)0x11124c;
                            println((fb_output_t *)pcVar36,
                                    "/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */"
                                   );
                            pcStack_9a8 = (code *)0x111259;
                            println((fb_output_t *)pcVar36,"");
                            pcStack_9a8 = (code *)0x11126a;
                            println((fb_output_t *)pcVar36,
                                    "#include \"flatcc/flatcc_json_parser.h\"");
                            pcStack_9a8 = (code *)0x111280;
                            __flatcc_fb_gen_c_includes
                                      ((fb_output_t *)pcVar36,"_json_parser.h","_JSON_PARSER_H");
                            if (((fb_output_t *)pcVar36)->opts->cgen_pragmas != 0) {
                              pcStack_9a8 = (code *)0x1112ad;
                              fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,
                                     (FILE *)((fb_output_t *)pcVar36)->fp);
                            }
                            pcStack_9a8 = (code *)0x1112be;
                            println((fb_output_t *)pcVar36,"");
                            pfVar15 = ((fb_output_t *)pcVar36)->S;
                            pfVar33 = (pfVar15->root_type).type;
                            pcStack_9a8 = (code *)0x1112dd;
                            memset(auStack_890,0,0xe8);
                            if ((pfVar33 != (fb_symbol_t *)0x0) && (pfVar33->kind < 2)) {
                              pcStack_9a8 = (code *)0x111303;
                              println((fb_output_t *)pcVar36,"/*");
                              pcStack_9a8 = (code *)0x111314;
                              println((fb_output_t *)pcVar36,
                                      " * Parses the default root table or struct of the schema and constructs a FlatBuffer."
                                     );
                              pcStack_9a8 = (code *)0x111325;
                              println((fb_output_t *)pcVar36," *");
                              pcStack_9a8 = (code *)0x111336;
                              println((fb_output_t *)pcVar36,
                                      " * Builder `B` must be initialized. `ctx` can be null but will hold"
                                     );
                              pcStack_9a8 = (code *)0x111347;
                              println((fb_output_t *)pcVar36,
                                      " * hold detailed error info on return when available.");
                              pcStack_9a8 = (code *)0x111358;
                              println((fb_output_t *)pcVar36,
                                      " * Returns 0 on success, or error code.");
                              pcStack_9a8 = (code *)0x111369;
                              println((fb_output_t *)pcVar36,
                                      " * `flags` : 0 by default, `flatcc_json_parser_f_skip_unknown` silently"
                                     );
                              pcStack_9a8 = (code *)0x11137a;
                              println((fb_output_t *)pcVar36,
                                      " * ignores unknown table and structs fields, and union types."
                                     );
                              pcStack_9a8 = (code *)0x11138b;
                              println((fb_output_t *)pcVar36," */");
                              pcStack_9a8 = (code *)0x1113aa;
                              println((fb_output_t *)pcVar36,
                                      "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,"
                                      ,((fb_output_t *)pcVar36)->S->basename);
                              ((fb_output_t *)pcVar36)->indent =
                                   ((fb_output_t *)pcVar36)->indent + 2;
                              pcStack_9a8 = (code *)0x1113c2;
                              println((fb_output_t *)pcVar36,
                                      "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags);"
                                     );
                              iVar10 = ((fb_output_t *)pcVar36)->indent;
                              if ((iVar10 == 0) ||
                                 (((fb_output_t *)pcVar36)->indent = iVar10 + -1, iVar10 + -1 == 0))
                              {
                                pcStack_9a8 = (code *)0x113012;
                                __assert_fail("out->indent",
                                              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                              ,0x6e9,"int gen_json_parser_prototypes(fb_output_t *)"
                                             );
                              }
                              ((fb_output_t *)pcVar36)->indent = iVar10 + -2;
                              pcStack_9a8 = (code *)0x1113fa;
                              println((fb_output_t *)pcVar36,"");
                              pfVar15 = ((fb_output_t *)pcVar36)->S;
                            }
                            pfVar33 = pfVar15->symbols;
                            if (pfVar33 == (fb_symbol_t *)0x0) goto LAB_0011158c;
                            goto LAB_0011142b;
                          }
                          pcVar36 = (char *)pfVar46[1].link;
                          pcStack_780 = (char *)0x111183;
                          __flatcc_fb_scoped_symbol_name((fb_scope_t *)pcVar36,pfVar46,&fStack_770);
                          if (1 < *(ushort *)(puVar32[3] + 0x10)) goto LAB_00111160;
                          pcVar36 = (char *)pfVar37->scope;
                          pcVar20 = "    __%ssort_vector_field(%s, %.*s, %s, t)\n";
                          pfStack_788 = &fStack_770;
                        }
                        else {
                          if (sVar3 == 10) {
                            pcVar36 = (char *)pfVar37->scope;
                            pcStack_780 = "string";
                          }
                          else {
                            if (sVar3 != 8) goto LAB_00111160;
                            if (0xb < *(int *)(puVar32 + 3) - 1U) {
                              pcStack_780 = (char *)0x1111d1;
                              __flatcc_fb_gen_c_sorter_cold_2();
                              goto LAB_001111d1;
                            }
                            pcStack_780 = &DAT_001418f0 +
                                          *(int *)(&DAT_001418f0 +
                                                  (ulong)(*(int *)(puVar32 + 3) - 1U) * 4);
                            pcVar36 = (char *)pfVar37->scope;
                          }
                          pcVar20 = "    __%ssort_vector_field(%s, %.*s, %s%s, t)\n";
                          pfStack_788 = pfVar37;
                        }
                        pfVar11 = (fb_scoped_name_t *)(ulong)uVar9;
                        pfStack_790 = (fb_scoped_name_t *)0x11115c;
                        fprintf((FILE *)pcVar36,pcVar20,pfVar37,&fStack_688);
                        pfVar41 = pfVar40;
                      }
LAB_00111160:
                    }
                  }
                }
                pcStack_780 = (char *)0x1110a9;
                fwrite("}\n\n",3,1,(FILE *)pfVar37->scope);
              }
              pfVar33 = pfVar33->link;
            } while (pfVar33 != (fb_symbol_t *)0x0);
          }
        }
        return 0;
      }
    }
    iVar8 = 0;
    pfVar28 = pfVar46;
    do {
      if ((pfVar28->kind & 0xfffb) == 0) {
        for (puVar24 = *(undefined8 **)&pfVar28[1].kind; puVar24 != (undefined8 *)0x0;
            puVar24 = (undefined8 *)*puVar24) {
          if ((*(ushort *)(puVar24 + 0xe) & 4) == 0) {
            if ((*(ushort *)(puVar24 + 0xe) >> 0xd & 1) != 0) {
              *(byte *)&pfVar28[8].kind = (byte)pfVar28[8].kind | 1;
            }
            if ((*(short *)(puVar24 + 5) == 0x10) || (*(short *)(puVar24 + 5) == 0xf)) {
              uVar2 = *(ushort *)(puVar24[3] + 0x10);
              pfVar11 = (fb_scoped_name_t *)(ulong)uVar2;
              if (((uVar2 & 0xfffb) == 0) && ((*(byte *)(puVar24[3] + 0xd0) & 3) != 0)) {
                *(byte *)&pfVar28[8].kind = (byte)pfVar28[8].kind | 1;
              }
            }
          }
        }
        iVar8 = (iVar8 + 1) - (uint)((pfVar28[8].kind & 3) == 0);
      }
      pfVar28 = pfVar28->link;
    } while (pfVar28 != (fb_symbol_t *)0x0);
    bVar48 = iVar10 != iVar8;
    iVar10 = iVar8;
  } while (bVar48);
  pcStack_780 = (char *)0x110d55;
  memset(&fStack_688,0,0xe8);
  if (pfVar46 != (fb_symbol_t *)0x0) {
    do {
      if ((pfVar46->kind == 0) && ((pfVar46[8].kind & 3) != 0)) {
        pcStack_780 = (char *)0x110d8a;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar46[1].link,pfVar46,&fStack_688);
        pcStack_780 = (char *)0x110da1;
        fprintf((FILE *)pfVar37->scope,"static void %s_sort(%s_mutable_table_t t);\n",&fStack_688,
                &fStack_688);
      }
      pfVar46 = pfVar46->link;
    } while (pfVar46 != (fb_symbol_t *)0x0);
  }
  goto LAB_00110da9;
LAB_0011142b:
  do {
    switch(pfVar33->kind) {
    case 0:
      pcStack_9a8 = (code *)0x111453;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar33[1].link,pfVar33,(fb_scoped_name_t *)auStack_890);
      pcVar20 = 
      "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    case 1:
      pcStack_9a8 = (code *)0x1114ca;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar33[1].link,pfVar33,(fb_scoped_name_t *)auStack_890);
      pcStack_9a8 = (code *)0x1114de;
      println((fb_output_t *)pcVar36,
              "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base);"
              ,(fb_scoped_name_t *)auStack_890);
      pcVar20 = 
      "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    default:
      goto switchD_00111442_caseD_2;
    case 3:
      pcStack_9a8 = (code *)0x111471;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar33[1].link,pfVar33,(fb_scoped_name_t *)auStack_890);
      pcStack_9a8 = (code *)0x111481;
      println((fb_output_t *)pcVar36,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_890);
      ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 2;
      pcStack_9a8 = (code *)0x111498;
      println((fb_output_t *)pcVar36,"int *value_type, uint64_t *value, int *aggregate);",
              (fb_scoped_name_t *)auStack_890);
      iVar10 = ((fb_output_t *)pcVar36)->indent;
      if ((iVar10 == 0) || (((fb_output_t *)pcVar36)->indent = iVar10 + -1, iVar10 + -1 == 0)) {
LAB_00112d20:
        pcStack_9a8 = (code *)0x112d3f;
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x709,"int gen_json_parser_prototypes(fb_output_t *)");
      }
      goto LAB_00111570;
    case 4:
      pcStack_9a8 = (code *)0x111506;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar33[1].link,pfVar33,(fb_scoped_name_t *)auStack_890);
      pcStack_9a8 = (code *)0x11151a;
      println((fb_output_t *)pcVar36,
              "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *pref);"
              ,(fb_scoped_name_t *)auStack_890);
      pcStack_9a8 = (code *)0x11152e;
      println((fb_output_t *)pcVar36,"static int %s_json_union_accept_type(uint8_t type);",
              (fb_scoped_name_t *)auStack_890);
      pcStack_9a8 = (code *)0x11153e;
      println((fb_output_t *)pcVar36,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_890);
      ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 2;
      pcStack_9a8 = (code *)0x111552;
      println((fb_output_t *)pcVar36,"int *value_type, uint64_t *value, int *aggregate);");
      iVar10 = ((fb_output_t *)pcVar36)->indent;
      if ((iVar10 == 0) || (((fb_output_t *)pcVar36)->indent = iVar10 + -1, iVar10 + -1 == 0)) {
        pcStack_9a8 = (code *)0x112d5e;
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6f9,"int gen_json_parser_prototypes(fb_output_t *)");
      }
LAB_00111570:
      ((fb_output_t *)pcVar36)->indent = iVar10 + -2;
      goto switchD_00111442_caseD_2;
    }
    pcStack_9a8 = (code *)0x1114f2;
    println((fb_output_t *)pcVar36,pcVar20,(fb_scoped_name_t *)auStack_890);
switchD_00111442_caseD_2:
    pfVar33 = pfVar33->link;
  } while (pfVar33 != (fb_symbol_t *)0x0);
  pfVar15 = ((fb_output_t *)pcVar36)->S;
LAB_0011158c:
  pcStack_9a8 = (code *)0x11159f;
  fb_scope_table_visit(&pfVar15->root_schema->scope_index,gen_local_scope_prototype,pcVar36);
  pcStack_9a8 = (code *)0x1115be;
  println((fb_output_t *)pcVar36,
          "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
          ,((fb_output_t *)pcVar36)->S->basename);
  ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 2;
  pcStack_9a8 = (code *)0x1115d6;
  println((fb_output_t *)pcVar36,"int *value_type, uint64_t *value, int *aggregate);");
  iVar10 = ((fb_output_t *)pcVar36)->indent;
  if (iVar10 != 0) {
    uVar9 = iVar10 - 1;
    pcVar25 = (code *)(ulong)uVar9;
    ((fb_output_t *)pcVar36)->indent = uVar9;
    if (uVar9 != 0) {
      ((fb_output_t *)pcVar36)->indent = iVar10 + -2;
      pcStack_9a8 = (code *)0x11160e;
      println((fb_output_t *)pcVar36,"");
      pfVar15 = ((fb_output_t *)pcVar36)->S;
      ct_00 = (fb_compound_type_t *)pfVar15->symbols;
      if (ct_00 != (fb_compound_type_t *)0x0) {
        do {
          switch((ct_00->symbol).kind) {
          case 0:
            uStack_958._0_4_ = 0;
            uStack_958._4_4_ = 0;
            if ((ct_00->symbol).kind != 0) {
LAB_00112d82:
              pcStack_9a8 = (code *)0x112da1;
              __assert_fail("ct->symbol.kind == fb_is_table",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5a3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            pcStack_9a8 = (code *)0x111672;
            auStack_980 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_998);
            uVar9 = uStack_998;
            if (0 < (int)uStack_998 && auStack_980 == (undefined1  [8])0x0) {
              pcStack_9a8 = (code *)0x112e03;
              __flatcc_fb_gen_c_json_parser_cold_1();
              goto LAB_00112e03;
            }
            uVar14 = (ulong)uStack_998;
            pgStack_978 = gen_field_match;
            pcVar25 = gen_field_unmatched;
            pgStack_970 = gen_field_unmatched;
            if ((int)uStack_998 < 1) {
              uVar44 = 0;
            }
            else {
              pcVar25 = (code *)(uVar14 << 5);
              pcVar29 = (code *)0x0;
              uVar44 = 0;
              do {
                uVar44 = (uVar44 + 1) -
                         (uint)(*(int *)((long)&((dict_entry_t *)auStack_980)->hint + (long)pcVar29)
                               == 0);
                pcVar29 = pcVar29 + 0x20;
              } while (pcVar25 != pcVar29);
            }
            uStack_960 = (ulong)uVar44 << 0x20;
            pcStack_9a8 = (code *)0x111d24;
            pfStack_968 = ct_00;
            memset((fb_scoped_name_t *)auStack_890,0,0xe8);
            pcStack_9a8 = (code *)0x111d33;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x111d47;
            println((fb_output_t *)pcVar36,
                    "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
                    ,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x111d58;
            println((fb_output_t *)pcVar36,"{");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x111d6f;
            println((fb_output_t *)pcVar36,"int more;");
            if (0 < (int)uVar9) {
              pcStack_9a8 = (code *)0x111d85;
              println((fb_output_t *)pcVar36,"void *pval;");
              pcStack_9a8 = (code *)0x111d96;
              println((fb_output_t *)pcVar36,"flatcc_builder_ref_t ref, *pref;");
              pcStack_9a8 = (code *)0x111da7;
              println((fb_output_t *)pcVar36,"const char *mark;");
              pcStack_9a8 = (code *)0x111db8;
              println((fb_output_t *)pcVar36,"uint64_t w;");
            }
            if (uVar44 == 0) {
              pcStack_9a8 = (code *)0x111e2b;
              println((fb_output_t *)pcVar36,"");
              pcStack_9a8 = (code *)0x111e3c;
              println((fb_output_t *)pcVar36,"*result = 0;");
              uVar30 = ct_00->count;
              pcVar20 = "if (flatcc_builder_start_table(ctx->ctx, %lu)) goto failed;";
            }
            else {
              pcStack_9a8 = (code *)0x111dd4;
              println((fb_output_t *)pcVar36,"size_t h_unions;");
              pcStack_9a8 = (code *)0x111de5;
              println((fb_output_t *)pcVar36,"");
              pcStack_9a8 = (code *)0x111df6;
              println((fb_output_t *)pcVar36,"*result = 0;");
              pcStack_9a8 = (code *)0x111e0e;
              println((fb_output_t *)pcVar36,
                      "if (flatcc_builder_start_table(ctx->ctx, %lu)) goto failed;",ct_00->count);
              uVar30 = (uint64_t)(int)uVar44;
              pcVar20 = 
              "if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, %lu, &h_unions)) goto failed;"
              ;
            }
            pcStack_9a8 = (code *)0x111e54;
            println((fb_output_t *)pcVar36,pcVar20,uVar30);
            pcStack_9a8 = (code *)0x111e65;
            println((fb_output_t *)pcVar36,
                    "buf = flatcc_json_parser_object_start(ctx, buf, end, &more);");
            pcStack_9a8 = (code *)0x111e76;
            println((fb_output_t *)pcVar36,"while (more) {");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x111e8d;
            println((fb_output_t *)pcVar36,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);");
            if ((int)uVar9 < 1) {
              pcStack_9a8 = (code *)0x111ec9;
              println((fb_output_t *)pcVar36,"/* Table has no fields. */");
              pcStack_9a8 = (code *)0x111eda;
              println((fb_output_t *)pcVar36,
                      "buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
            }
            else {
              pcStack_9a8 = (code *)0x111ea3;
              println((fb_output_t *)pcVar36,"w = flatcc_json_parser_symbol_part(buf, end);");
              pcVar25 = (code *)(ulong)(uVar9 - 1);
              pfVar11 = (fb_scoped_name_t *)0x0;
              pcStack_9a8 = (code *)0x111eb9;
              gen_trie((fb_output_t *)pcVar36,(trie_t *)auStack_980,0,uVar9 - 1,0);
            }
            pcStack_9a8 = (code *)0x111eeb;
            println((fb_output_t *)pcVar36,
                    "buf = flatcc_json_parser_object_end(ctx, buf, end, &more);");
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112dfe;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5d3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x111f12;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x111f23;
            println((fb_output_t *)pcVar36,"if (ctx->error) goto failed;");
            if (0 < (int)uVar9) {
              bVar48 = true;
              lVar43 = 0;
              do {
                lVar5 = *(long *)((long)((long)auStack_980 + 0x10) + lVar43);
                uVar2 = *(ushort *)(lVar5 + 0x70);
                pcVar25 = (code *)(ulong)uVar2;
                if ((uVar2 & 4) == 0) {
                  if ((ushort)((short)*(undefined4 *)(lVar5 + 0x28) - 0xfU) < 2) {
                    lVar31 = -(ulong)(*(short *)(*(long *)(lVar5 + 0x18) + 0x10) == 4);
                  }
                  else {
                    lVar31 = 0;
                  }
                  if ((uVar2 >> 8 & 1) != 0) {
                    lVar31 = lVar31 + *(long *)(lVar5 + 0x88);
                    if (bVar48) {
                      bVar48 = false;
                      pcStack_9a8 = (code *)0x111fa1;
                      println((fb_output_t *)pcVar36,
                              "if (!flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar31);
                      ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
                    }
                    else {
                      bVar48 = false;
                      pcStack_9a8 = (code *)0x111f8c;
                      println((fb_output_t *)pcVar36,
                              "||  !flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar31);
                    }
                  }
                }
                lVar43 = lVar43 + 0x20;
              } while (uVar14 << 5 != lVar43);
              if (!bVar48) {
                if (((fb_output_t *)pcVar36)->indent == 0) {
                  pcStack_9a8 = (code *)0x112ff3;
                  __assert_fail("out->indent",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                ,0x5e7,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
                }
                ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
                pcStack_9a8 = (code *)0x111fe2;
                println((fb_output_t *)pcVar36,") {");
                ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
                pcStack_9a8 = (code *)0x111ff9;
                println((fb_output_t *)pcVar36,
                        "buf = flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_required);"
                       );
                pcStack_9a8 = (code *)0x11200a;
                println((fb_output_t *)pcVar36,"goto failed;");
                if (((fb_output_t *)pcVar36)->indent == 0) {
                  pcStack_9a8 = (code *)0x112fd4;
                  __assert_fail("out->indent",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                ,0x5ea,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
                }
                ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
                pcStack_9a8 = (code *)0x112031;
                println((fb_output_t *)pcVar36,"}");
              }
            }
            if (uStack_960._4_4_ != 0) {
              pcStack_9a8 = (code *)0x112049;
              println((fb_output_t *)pcVar36,
                      "buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);");
            }
            pcStack_9a8 = (code *)0x11205d;
            println((fb_output_t *)pcVar36,
                    "if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;");
            pcStack_9a8 = (code *)0x11206e;
            println((fb_output_t *)pcVar36,"return buf;");
            ((fb_output_t *)pcVar36)->tmp_indent = ((fb_output_t *)pcVar36)->indent;
            ((fb_output_t *)pcVar36)->indent = 0;
            pcStack_9a8 = (code *)0x112095;
            println((fb_output_t *)pcVar36,"failed:");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->tmp_indent;
            pcStack_9a8 = (code *)0x1120b2;
            println((fb_output_t *)pcVar36,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                   );
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112ddf;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5f6,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x1120dc;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x1120f0;
            println((fb_output_t *)pcVar36,"");
            pcStack_9a8 = (code *)0x11210c;
            println((fb_output_t *)pcVar36,
                    "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
                    ,auStack_890);
            pcStack_9a8 = (code *)0x11211d;
            println((fb_output_t *)pcVar36,"{");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x112137;
            println((fb_output_t *)pcVar36,
                    "return flatcc_json_parser_table_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_table);"
                    ,auStack_890);
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112dc0;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5fc,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x11215a;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x112167;
            println((fb_output_t *)pcVar36,"");
            if (auStack_980 != (undefined1  [8])0x0) {
              pcStack_9a8 = (code *)0x112179;
              free((void *)auStack_980);
            }
            break;
          case 1:
            uStack_960 = 0;
            uStack_958._0_4_ = 0;
            uStack_958._4_4_ = 0;
            if ((ct_00->symbol).kind != 1) {
              pcStack_9a8 = (code *)0x112e41;
              __assert_fail("ct->symbol.kind == fb_is_struct",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x54a,
                            "int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
            }
            pcStack_9a8 = (code *)0x111721;
            auStack_980 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_998);
            uVar9 = uStack_998;
            if (0 < (int)uStack_998 && auStack_980 == (undefined1  [8])0x0) {
              pcStack_9a8 = (code *)0x112d82;
              __flatcc_fb_gen_c_json_parser_cold_2();
              goto LAB_00112d82;
            }
            uStack_960 = CONCAT44(uStack_960._4_4_,1);
            pgStack_978 = gen_field_match;
            pgStack_970 = gen_field_unmatched;
            pcStack_9a8 = (code *)0x111776;
            pfStack_968 = ct_00;
            memset((fb_scoped_name_t *)auStack_890,0,0xe8);
            pcStack_9a8 = (code *)0x111785;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x111799;
            println((fb_output_t *)pcVar36,
                    "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)"
                    ,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x1117aa;
            println((fb_output_t *)pcVar36,"{");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x1117c1;
            println((fb_output_t *)pcVar36,"int more;");
            if (0 < (int)uVar9) {
              pcStack_9a8 = (code *)0x1117d7;
              println((fb_output_t *)pcVar36,"flatcc_builder_ref_t ref;");
              pcStack_9a8 = (code *)0x1117e8;
              println((fb_output_t *)pcVar36,"void *pval;");
              pcStack_9a8 = (code *)0x1117f9;
              println((fb_output_t *)pcVar36,"const char *mark;");
              pcStack_9a8 = (code *)0x11180a;
              println((fb_output_t *)pcVar36,"uint64_t w;");
            }
            pcStack_9a8 = (code *)0x11181b;
            println((fb_output_t *)pcVar36,"");
            pcStack_9a8 = (code *)0x11182c;
            println((fb_output_t *)pcVar36,
                    "buf = flatcc_json_parser_object_start(ctx, buf, end, &more);");
            pcStack_9a8 = (code *)0x11183d;
            println((fb_output_t *)pcVar36,"while (more) {");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            if (uVar9 == 0) {
              pcStack_9a8 = (code *)0x11219b;
              println((fb_output_t *)pcVar36,"/* Empty struct. */");
              pcStack_9a8 = (code *)0x1121ac;
              println((fb_output_t *)pcVar36,
                      "buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
            }
            else {
              pcStack_9a8 = (code *)0x11185d;
              println((fb_output_t *)pcVar36,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);"
                     );
              pcStack_9a8 = (code *)0x11186e;
              println((fb_output_t *)pcVar36,"w = flatcc_json_parser_symbol_part(buf, end);");
              pfVar11 = (fb_scoped_name_t *)0x0;
              pcStack_9a8 = (code *)0x111884;
              gen_trie((fb_output_t *)pcVar36,(trie_t *)auStack_980,0,uVar9 - 1,0);
            }
            pcStack_9a8 = (code *)0x1121bd;
            println((fb_output_t *)pcVar36,
                    "buf = flatcc_json_parser_object_end(ctx, buf, end , &more);");
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112d7d;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x56b,
                            "int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x1121e4;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x1121f5;
            println((fb_output_t *)pcVar36,"return buf;");
            if (0 < (int)uVar9) {
              ((fb_output_t *)pcVar36)->tmp_indent = ((fb_output_t *)pcVar36)->indent;
              ((fb_output_t *)pcVar36)->indent = 0;
              pcStack_9a8 = (code *)0x112221;
              println((fb_output_t *)pcVar36,"failed:");
              ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->tmp_indent;
              pcStack_9a8 = (code *)0x11223e;
              println((fb_output_t *)pcVar36,
                      "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                     );
            }
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112ebd;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x574,
                            "int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x112265;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x112276;
            println((fb_output_t *)pcVar36,"");
            if (auStack_980 != (undefined1  [8])0x0) {
              pcStack_9a8 = (code *)0x112285;
              free((void *)auStack_980);
            }
            if ((ct_00->symbol).kind != 1) {
              pcStack_9a8 = (code *)0x112e60;
              __assert_fail("ct->symbol.kind == fb_is_struct",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x57e,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
            }
            pcStack_9a8 = (code *)0x1122a0;
            memset((fb_scoped_name_t *)auStack_890,0,0xe8);
            pcStack_9a8 = (code *)0x1122af;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x1122c3;
            println((fb_output_t *)pcVar36,
                    "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
                    ,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x1122d7;
            println((fb_output_t *)pcVar36,"{");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x1122ee;
            println((fb_output_t *)pcVar36,"void *pval;");
            pcStack_9a8 = (code *)0x112302;
            println((fb_output_t *)pcVar36,"");
            pcStack_9a8 = (code *)0x112313;
            println((fb_output_t *)pcVar36,"*result = 0;");
            pcVar25 = (code *)(ulong)ct_00->align;
            pcStack_9a8 = (code *)0x112333;
            println((fb_output_t *)pcVar36,
                    "if (!(pval = flatcc_builder_start_struct(ctx->ctx, %lu, %u))) goto failed;",
                    ct_00->size,pcVar25);
            pcStack_9a8 = (code *)0x112347;
            println((fb_output_t *)pcVar36,"buf = %s_parse_json_struct_inline(ctx, buf, end, pval);"
                    ,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x112358;
            println((fb_output_t *)pcVar36,
                    "if (ctx->error || !(*result = flatcc_builder_end_struct(ctx->ctx))) goto failed;"
                   );
            pcStack_9a8 = (code *)0x112369;
            println((fb_output_t *)pcVar36,"return buf;");
            ((fb_output_t *)pcVar36)->tmp_indent = ((fb_output_t *)pcVar36)->indent;
            ((fb_output_t *)pcVar36)->indent = 0;
            pcStack_9a8 = (code *)0x112390;
            println((fb_output_t *)pcVar36,"failed:");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->tmp_indent;
            pcStack_9a8 = (code *)0x1123ad;
            println((fb_output_t *)pcVar36,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                   );
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112e9e;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x58f,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x1123da;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x1123e7;
            println((fb_output_t *)pcVar36,"");
            pcStack_9a8 = (code *)0x1123fb;
            println((fb_output_t *)pcVar36,
                    "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
                    ,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x112408;
            println((fb_output_t *)pcVar36,"{");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x112422;
            println((fb_output_t *)pcVar36,
                    "return flatcc_json_parser_struct_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_struct);"
                    ,(fb_scoped_name_t *)auStack_890);
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112e7f;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x595,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x112445;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x112452;
            println((fb_output_t *)pcVar36,"");
            break;
          case 3:
            pcStack_9a8 = (code *)0x1116f1;
            gen_enum_parser((fb_output_t *)pcVar36,ct_00);
            break;
          case 4:
            pcStack_9a8 = (code *)0x111898;
            memset((fb_scoped_name_t *)auStack_890,0,0xe8);
            pcStack_9a8 = (code *)0x1118a9;
            memset(auStack_980,0,0xe8);
            pcStack_9a8 = (code *)0x1118b8;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x1118cc;
            println((fb_output_t *)pcVar36,
                    "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)"
                    ,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x1118dd;
            println((fb_output_t *)pcVar36,"{");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x1118f0;
            println((fb_output_t *)pcVar36,"");
            pcStack_9a8 = (code *)0x111901;
            println((fb_output_t *)pcVar36,"*result = 0;");
            pcStack_9a8 = (code *)0x111912;
            println((fb_output_t *)pcVar36,"switch (type) {");
            pcStack_9a8 = (code *)0x111923;
            println((fb_output_t *)pcVar36,"case 0: /* NONE */");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x11193a;
            println((fb_output_t *)pcVar36,"return flatcc_json_parser_none(ctx, buf, end);");
            if (((fb_output_t *)pcVar36)->indent == 0) {
LAB_00112e03:
              pcStack_9a8 = (code *)0x112e22;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x614,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            for (pfVar33 = ct_00->members; pfVar33 != (fb_symbol_t *)0x0; pfVar33 = pfVar33->link) {
              uVar4 = pfVar33[1].kind;
              if (uVar4 != 0) {
                pfVar11 = (fb_scoped_name_t *)pfVar33->ident->text;
                uVar9 = (uint)pfVar33->ident->len;
                if (uVar4 == 0xb) {
                  pcStack_9a8 = (code *)0x111a24;
                  println((fb_output_t *)pcVar36,"case %u: /* %.*s */",
                          (ulong)*(uint *)&pfVar33[3].link,(ulong)uVar9);
                  ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
                  pcStack_9a8 = (code *)0x111a3b;
                  println((fb_output_t *)pcVar36,
                          "buf = flatcc_json_parser_build_string(ctx, buf, end, result);");
                  pcStack_9a8 = (code *)0x111a4c;
                  println((fb_output_t *)pcVar36,"break;");
                  iVar10 = ((fb_output_t *)pcVar36)->indent;
                  if (iVar10 == 0) {
                    pcStack_9a8 = (code *)0x112d1b;
                    __assert_fail("out->indent",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                  ,0x631,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)"
                                 );
                  }
                }
                else {
                  if (uVar4 != 0xf) {
                    pcStack_9a8 = (code *)0x112cdd;
                    __flatcc_fb_gen_c_json_parser_cold_4();
LAB_00112cdd:
                    pcStack_9a8 = (code *)0x112cfc;
                    __assert_fail("out->indent",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                  ,0x62b,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)"
                                 );
                  }
                  pcStack_9a8 = (code *)0x111998;
                  __flatcc_fb_scoped_symbol_name
                            ((fb_scope_t *)pfVar33[1].link[1].link,pfVar33[1].link,
                             (fb_scoped_name_t *)auStack_980);
                  pcStack_9a8 = (code *)0x1119b2;
                  println((fb_output_t *)pcVar36,"case %u: /* %.*s */",
                          (ulong)*(uint *)&pfVar33[3].link,(ulong)uVar9);
                  ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
                  uVar4 = (pfVar33[1].link)->kind;
                  pcVar20 = "buf = %s_parse_json_table(ctx, buf, end, result);";
                  if (uVar4 != 0) {
                    if (uVar4 != 1) {
                      pcStack_9a8 = (code *)0x112d20;
                      __flatcc_fb_gen_c_json_parser_cold_3();
                      goto LAB_00112d20;
                    }
                    pcVar20 = "buf = %s_parse_json_struct(ctx, buf, end, result);";
                  }
                  pcStack_9a8 = (code *)0x1119ea;
                  println((fb_output_t *)pcVar36,pcVar20,auStack_980);
                  pcStack_9a8 = (code *)0x1119fb;
                  println((fb_output_t *)pcVar36,"break;");
                  iVar10 = ((fb_output_t *)pcVar36)->indent;
                  if (iVar10 == 0) goto LAB_00112cdd;
                }
                ((fb_output_t *)pcVar36)->indent = iVar10 + -1;
              }
            }
            pcStack_9a8 = (code *)0x111a7b;
            println((fb_output_t *)pcVar36,"default:");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x111a92;
            println((fb_output_t *)pcVar36,
                    "if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x111aa9;
            println((fb_output_t *)pcVar36,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);"
                   );
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112f77;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x63c,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x111ad0;
            println((fb_output_t *)pcVar36,"} else {");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x111ae7;
            println((fb_output_t *)pcVar36,"return flatcc_json_parser_generic_json(ctx, buf, end);")
            ;
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112f58;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x63e,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x111b18;
            println((fb_output_t *)pcVar36,"}");
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112f39;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x63f,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x111b3b;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x111b4c;
            println((fb_output_t *)pcVar36,"if (ctx->error) return buf;");
            pcStack_9a8 = (code *)0x111b5d;
            println((fb_output_t *)pcVar36,"if (!*result) {");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x111b74;
            println((fb_output_t *)pcVar36,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                   );
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112f1a;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x643,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x111b97;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x111ba8;
            println((fb_output_t *)pcVar36,"return buf;");
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112efb;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x645,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x111bcb;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x111bdc;
            println((fb_output_t *)pcVar36,"");
            pcStack_9a8 = (code *)0x111beb;
            memset((fb_scoped_name_t *)auStack_890,0,0xe8);
            pcStack_9a8 = (code *)0x111bfa;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x111c0e;
            println((fb_output_t *)pcVar36,"static int %s_json_union_accept_type(uint8_t type)",
                    (fb_scoped_name_t *)auStack_890);
            pcStack_9a8 = (code *)0x111c1b;
            println((fb_output_t *)pcVar36,"{");
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
            pcStack_9a8 = (code *)0x111c32;
            println((fb_output_t *)pcVar36,"switch (type) {");
            for (pfVar33 = ct_00->members; pfVar33 != (fb_symbol_t *)0x0; pfVar33 = pfVar33->link) {
              if (pfVar33[1].kind == 0) {
                pcStack_9a8 = (code *)0x111c78;
                println((fb_output_t *)pcVar36,"case 0: return 1; /* NONE */");
              }
              else {
                pfVar11 = (fb_scoped_name_t *)pfVar33->ident->text;
                pcStack_9a8 = (code *)0x111c69;
                println((fb_output_t *)pcVar36,"case %u: return 1; /* %.*s */",
                        (ulong)*(uint *)&pfVar33[3].link,(ulong)(uint)pfVar33->ident->len);
              }
            }
            pcStack_9a8 = (code *)0x111c91;
            println((fb_output_t *)pcVar36,"default: return 0;");
            iVar10 = ((fb_output_t *)pcVar36)->indent;
            uVar9 = iVar10 + 1;
            pcVar25 = (code *)(ulong)uVar9;
            ((fb_output_t *)pcVar36)->indent = uVar9;
            if (uVar9 == 0) {
              pcStack_9a8 = (code *)0x112edc;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x663,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)")
              ;
            }
            ((fb_output_t *)pcVar36)->indent = iVar10;
            pcStack_9a8 = (code *)0x111cc1;
            println((fb_output_t *)pcVar36,"}");
            if (((fb_output_t *)pcVar36)->indent == 0) {
              pcStack_9a8 = (code *)0x112f96;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x664,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)")
              ;
            }
            ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
            pcStack_9a8 = (code *)0x111ceb;
            println((fb_output_t *)pcVar36,"}");
            pcStack_9a8 = (code *)0x111cff;
            println((fb_output_t *)pcVar36,"");
            pcStack_9a8 = (code *)0x111d0a;
            gen_enum_parser((fb_output_t *)pcVar36,ct_00);
          }
          ct_00 = (fb_compound_type_t *)(ct_00->symbol).link;
        } while (ct_00 != (fb_compound_type_t *)0x0);
        pfVar15 = ((fb_output_t *)pcVar36)->S;
      }
      pcStack_9a8 = (code *)0x112487;
      fb_scope_table_visit(&pfVar15->root_schema->scope_index,gen_local_scope_parser,pcVar36);
      auStack_980 = (undefined1  [8])0x0;
      pgStack_978 = (gen_match_f *)0x0;
      pgStack_970 = (gen_unmatched_f *)0x0;
      pfStack_968 = (fb_compound_type_t *)0x0;
      uStack_960._0_4_ = 0;
      uStack_960._4_4_ = 0;
      uStack_958._0_4_ = 0;
      uStack_958._4_4_ = 0;
      pfStack_838 = ((fb_output_t *)pcVar36)->S;
      pfStack_990 = pfStack_838->root_schema;
      auStack_890._8_8_ = 0;
      peStack_850 = (enum_entry_t *)0x0;
      psStack_848 = (service_entry_t *)0x0;
      pcStack_860 = (char *)0x0;
      poStack_858 = (object_entry_t *)0x0;
      peStack_870 = (enum_entry_t *)0x0;
      psStack_868 = (service_entry_t *)0x0;
      auStack_890._16_8_ = 0;
      poStack_878 = (object_entry_t *)0x0;
      pcStack_840 = (char *)0x0;
      auStack_890._0_4_ = 1;
      auStack_890._4_4_ = 0;
      pcStack_9a8 = (code *)0x1124eb;
      fb_scope_table_visit(&pfStack_990->scope_index,count_symbols,auStack_890);
      bStack_999 = 0 < (long)(int)auStack_890._4_4_;
      pcStack_9a8 = (code *)0x112501;
      peVar16 = (entry_t *)calloc((long)(int)auStack_890._4_4_,0x10);
      uVar49 = auStack_890._8_4_;
      uVar14 = auStack_890._8_8_ & 0xffffffff;
      pcStack_9a8 = (code *)0x112519;
      poStack_878 = peVar16;
      peVar17 = (entry_t *)calloc((long)(int)auStack_890._8_4_,0x10);
      iStack_994 = auStack_890._12_4_;
      pcStack_9a8 = (code *)0x112535;
      peStack_870 = peVar17;
      peVar18 = (entry_t *)calloc((long)(int)auStack_890._12_4_,0x10);
      sStack_988 = auStack_890._16_8_;
      pcStack_9a8 = (code *)0x11254a;
      psStack_868 = peVar18;
      pcStack_860 = (char *)malloc(auStack_890._16_8_);
      poStack_858 = peVar16;
      peStack_850 = peVar17;
      psStack_848 = peVar18;
      pcStack_840 = pcStack_860;
      if (((((bStack_999 & peVar16 == (entry_t *)0x0) == 0) &&
           ((int)uVar49 < 1 || peVar17 != (entry_t *)0x0)) &&
          (iStack_994 < 1 || peVar18 != (entry_t *)0x0)) &&
         (uVar26 = CONCAT71((int7)((ulong)pcVar25 >> 8),sStack_988 != 0),
         sStack_988 == 0 || pcStack_860 != (char *)0x0)) {
        pcStack_9a8 = (code *)0x1125cb;
        fb_scope_table_visit(&pfStack_990->scope_index,install_symbols,auStack_890);
        pcStack_9a8 = (code *)0x1125d8;
        sort_entries(poStack_878,auStack_890._4_4_);
        pcStack_9a8 = (code *)0x1125e5;
        sort_entries(peStack_870,auStack_890._8_4_);
        pcVar20 = (char *)(ulong)(uint)auStack_890._12_4_;
        pcStack_9a8 = (code *)0x1125f2;
        sort_entries(psStack_868,auStack_890._12_4_);
        iVar10 = auStack_890._8_4_;
        sVar12 = (size_t)(int)auStack_890._8_4_;
        if (sVar12 == 0) {
          iVar10 = 0;
          auStack_980 = (undefined1  [8])0x0;
        }
        else {
          pcStack_9a8 = (code *)0x112607;
          __base = (dict_entry_t *)malloc(sVar12 << 5);
          peVar7 = peStack_870;
          if (__base == (dict_entry_t *)0x0) {
            auStack_980 = (undefined1  [8])0x0;
            if (0 < iVar10) {
              puVar39 = auStack_890;
              pcStack_9a8 = println;
              __flatcc_fb_gen_c_json_parser_cold_5();
              if (println_spaces[0] == '\0') {
                builtin_strncpy(println_spaces + 0x30,"                ",0x10);
                builtin_strncpy(println_spaces + 0x20,"                ",0x10);
                builtin_strncpy(println_spaces + 0x10,"                ",0x10);
                builtin_strncpy(println_spaces,"                ",0x10);
              }
              uStack_a60 = uVar26;
              pfStack_a58 = pfVar11;
              pfStack_a50 = pfVar41;
              pfStack_9c8 = (fb_output_t *)pcVar36;
              uStack_9c0 = uVar14;
              peStack_9b8 = peVar16;
              sStack_9b0 = sVar12;
              pcStack_9a8 = (code *)auStack_890;
              if (*pcVar20 != '\0') {
                uVar44 = *(int *)(*(long *)(puVar39 + 0xe0) + 0xd0) * *(int *)(puVar39 + 0xf0);
                uVar9 = uVar44;
                if (0x40 < (int)uVar44) {
                  do {
                    fprintf(*(FILE **)(puVar39 + 0xd0),"%.*s",0x40,println_spaces);
                    uVar9 = uVar44 - 0x40;
                    bVar48 = 0x80 < uVar44;
                    uVar44 = uVar9;
                  } while (bVar48);
                }
                fprintf(*(FILE **)(puVar39 + 0xd0),"%.*s",(ulong)uVar9,println_spaces);
                uStack_a98 = 0x3000000010;
                puStack_a90 = &uStack_998;
                puStack_a88 = auStack_a78;
                vfprintf(*(FILE **)(puVar39 + 0xd0),pcVar20,&uStack_a98);
              }
              iVar10 = fputc(10,*(FILE **)(puVar39 + 0xd0));
              return iVar10;
            }
          }
          else {
            lVar43 = 8;
            sVar34 = sVar12;
            do {
              pcVar20 = *(char **)((long)&peVar7->ct + lVar43);
              *(char **)((long)__base + lVar43 * 2 + -0x10) = pcVar20;
              pcStack_9a8 = (code *)0x11262f;
              sVar19 = strlen(pcVar20);
              *(int *)((long)__base + lVar43 * 2 + -8) = (int)sVar19;
              *(undefined8 *)((long)&__base->text + lVar43 * 2) =
                   *(undefined8 *)((long)peVar7 + lVar43 + -8);
              *(undefined4 *)((long)&__base->len + lVar43 * 2) = 0;
              lVar43 = lVar43 + 0x10;
              sVar34 = sVar34 - 1;
            } while (sVar34 != 0);
            pcStack_9a8 = (code *)0x112666;
            qsort(__base,sVar12,0x20,dict_cmp);
            iVar10 = auStack_890._8_4_;
            auStack_980 = (undefined1  [8])__base;
          }
        }
        pfStack_968 = (fb_compound_type_t *)0x0;
        uStack_960._0_4_ = 4;
        pgStack_978 = gen_scope_match;
        pgStack_970 = gen_scope_unmatched;
        pcStack_9a8 = (code *)0x1126d7;
        println((fb_output_t *)pcVar36,
                "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
                ,((fb_output_t *)pcVar36)->S->basename);
        ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 2;
        pcStack_9a8 = (code *)0x1126ef;
        println((fb_output_t *)pcVar36,"int *value_type, uint64_t *value, int *aggregate)");
        iVar8 = ((fb_output_t *)pcVar36)->indent;
        if ((iVar8 == 0) || (((fb_output_t *)pcVar36)->indent = iVar8 + -1, iVar8 + -1 == 0)) {
          pcStack_9a8 = (code *)0x1130cc;
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x4ea,"int gen_global_scope_parser(fb_output_t *)");
        }
        ((fb_output_t *)pcVar36)->indent = iVar8 + -2;
        pcStack_9a8 = (code *)0x112727;
        println((fb_output_t *)pcVar36,"{");
        ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
        if (iVar10 == 0) {
          pcStack_9a8 = (code *)0x1127ee;
          println((fb_output_t *)pcVar36,"/* Global scope has no enum / union types to look up. */")
          ;
          pcStack_9a8 = (code *)0x1127ff;
          println((fb_output_t *)pcVar36,"return buf; /* unmatched; */");
          iVar10 = ((fb_output_t *)pcVar36)->indent;
          if (iVar10 == 0) {
            pcStack_9a8 = (code *)0x1130eb;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x4ef,"int gen_global_scope_parser(fb_output_t *)");
          }
        }
        else {
          pcStack_9a8 = (code *)0x112747;
          println((fb_output_t *)pcVar36,"const char *unmatched = buf;");
          pcStack_9a8 = (code *)0x112758;
          println((fb_output_t *)pcVar36,"const char *mark;");
          pcStack_9a8 = (code *)0x112769;
          println((fb_output_t *)pcVar36,"uint64_t w;");
          pcStack_9a8 = (code *)0x11277a;
          println((fb_output_t *)pcVar36,"");
          pcStack_9a8 = (code *)0x11278b;
          println((fb_output_t *)pcVar36,"w = flatcc_json_parser_symbol_part(buf, end);");
          pcStack_9a8 = (code *)0x1127a3;
          gen_trie((fb_output_t *)pcVar36,(trie_t *)auStack_980,0,iVar10 + -1,0);
          pcStack_9a8 = (code *)0x1127b4;
          println((fb_output_t *)pcVar36,"return buf;");
          iVar10 = ((fb_output_t *)pcVar36)->indent;
          if (iVar10 == 0) {
            pcStack_9a8 = (code *)0x1127dd;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x4f8,"int gen_global_scope_parser(fb_output_t *)");
          }
        }
        ((fb_output_t *)pcVar36)->indent = iVar10 + -1;
        pcStack_9a8 = (code *)0x112826;
        println((fb_output_t *)pcVar36,"}");
        pcStack_9a8 = (code *)0x112837;
        println((fb_output_t *)pcVar36,"");
        if (auStack_980 != (undefined1  [8])0x0) {
          pcStack_9a8 = (code *)0x112846;
          free((void *)auStack_980);
        }
      }
      pcStack_9a8 = (code *)0x112853;
      clear_catalog((catalog_t *)auStack_890);
      pfVar33 = (((fb_output_t *)pcVar36)->S->root_type).type;
      if (pfVar33 != (fb_symbol_t *)0x0) {
        if (pfVar33->kind == 1) {
          pcStack_9a8 = (code *)0x1129b3;
          memset((fb_scoped_name_t *)auStack_890,0,0xe8);
          pcStack_9a8 = (code *)0x1129c2;
          __flatcc_fb_scoped_symbol_name
                    ((fb_scope_t *)pfVar33[1].link,pfVar33,(fb_scoped_name_t *)auStack_890);
          pcStack_9a8 = (code *)0x1129e1;
          println((fb_output_t *)pcVar36,
                  "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
                  ((fb_output_t *)pcVar36)->S->basename);
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 2;
          pcStack_9a8 = (code *)0x1129f9;
          println((fb_output_t *)pcVar36,"const char *buf, size_t bufsiz, int flags)");
          iVar10 = ((fb_output_t *)pcVar36)->indent;
          if ((iVar10 == 0) || (((fb_output_t *)pcVar36)->indent = iVar10 + -1, iVar10 + -1 == 0)) {
            pcStack_9a8 = (code *)0x113050;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x6a2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar36)->indent = iVar10 + -2;
          pcStack_9a8 = (code *)0x112a31;
          println((fb_output_t *)pcVar36,"{");
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
          pcStack_9a8 = (code *)0x112a48;
          println((fb_output_t *)pcVar36,"flatcc_json_parser_t ctx_;");
          pcStack_9a8 = (code *)0x112a59;
          println((fb_output_t *)pcVar36,"flatcc_builder_ref_t root;");
          pcStack_9a8 = (code *)0x112a6a;
          println((fb_output_t *)pcVar36,"");
          pcStack_9a8 = (code *)0x112a7b;
          println((fb_output_t *)pcVar36,"ctx = ctx ? ctx : &ctx_;");
          pcStack_9a8 = (code *)0x112a8c;
          println((fb_output_t *)pcVar36,
                  "flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
          pfVar15 = ((fb_output_t *)pcVar36)->S;
          if ((pfVar15->file_identifier).type == 3) {
            pcStack_9a8 = (code *)0x112ab6;
            println((fb_output_t *)pcVar36,
                    "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                    (ulong)(uint)(pfVar15->file_identifier).field_0.s.len,
                    (pfVar15->file_identifier).field_0.s.s);
          }
          else {
            pcStack_9a8 = (code *)0x112ba5;
            println((fb_output_t *)pcVar36,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;"
                   );
          }
          pcStack_9a8 = (code *)0x112bbe;
          println((fb_output_t *)pcVar36,
                  "buf = %s_parse_json_struct(ctx, buf, buf + bufsiz, &root);",auStack_890);
          pcStack_9a8 = (code *)0x112bcf;
          println((fb_output_t *)pcVar36,"if (ctx->error) {");
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
          pcStack_9a8 = (code *)0x112be6;
          println((fb_output_t *)pcVar36,"return ctx->error;");
          if (((fb_output_t *)pcVar36)->indent == 0) {
            pcStack_9a8 = (code *)0x11308e;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x6b2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
          pcStack_9a8 = (code *)0x112c0d;
          println((fb_output_t *)pcVar36,"}");
          pcStack_9a8 = (code *)0x112c1e;
          println((fb_output_t *)pcVar36,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
          pcStack_9a8 = (code *)0x112c2f;
          println((fb_output_t *)pcVar36,"ctx->end_loc = buf;");
          pcStack_9a8 = (code *)0x112c40;
          println((fb_output_t *)pcVar36,"return 0;");
          iVar10 = ((fb_output_t *)pcVar36)->indent;
          if (iVar10 == 0) {
            pcStack_9a8 = (code *)0x1130ad;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x6b6,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
          }
        }
        else {
          if (pfVar33->kind != 0) goto LAB_00112c78;
          pcStack_9a8 = (code *)0x112894;
          memset((fb_scoped_name_t *)auStack_890,0,0xe8);
          pcStack_9a8 = (code *)0x1128a3;
          __flatcc_fb_scoped_symbol_name
                    ((fb_scope_t *)pfVar33[1].link,pfVar33,(fb_scoped_name_t *)auStack_890);
          pcStack_9a8 = (code *)0x1128c2;
          println((fb_output_t *)pcVar36,
                  "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
                  ((fb_output_t *)pcVar36)->S->basename);
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 2;
          pcStack_9a8 = (code *)0x1128da;
          println((fb_output_t *)pcVar36,
                  "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags)");
          iVar10 = ((fb_output_t *)pcVar36)->indent;
          if ((iVar10 == 0) || (((fb_output_t *)pcVar36)->indent = iVar10 + -1, iVar10 + -1 == 0)) {
            pcStack_9a8 = (code *)0x113031;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x67f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar36)->indent = iVar10 + -2;
          pcStack_9a8 = (code *)0x112912;
          println((fb_output_t *)pcVar36,"{");
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
          pcStack_9a8 = (code *)0x112929;
          println((fb_output_t *)pcVar36,"flatcc_json_parser_t parser;");
          pcStack_9a8 = (code *)0x11293a;
          println((fb_output_t *)pcVar36,"flatcc_builder_ref_t root;");
          pcStack_9a8 = (code *)0x11294b;
          println((fb_output_t *)pcVar36,"");
          pcStack_9a8 = (code *)0x11295c;
          println((fb_output_t *)pcVar36,"ctx = ctx ? ctx : &parser;");
          pcStack_9a8 = (code *)0x11296d;
          println((fb_output_t *)pcVar36,
                  "flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
          pfVar15 = ((fb_output_t *)pcVar36)->S;
          if ((pfVar15->file_identifier).type == 3) {
            pcStack_9a8 = (code *)0x112997;
            println((fb_output_t *)pcVar36,
                    "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                    (ulong)(uint)(pfVar15->file_identifier).field_0.s.len,
                    (pfVar15->file_identifier).field_0.s.s);
          }
          else {
            pcStack_9a8 = (code *)0x112acc;
            println((fb_output_t *)pcVar36,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;"
                   );
          }
          pcStack_9a8 = (code *)0x112ae5;
          println((fb_output_t *)pcVar36,"%s_parse_json_table(ctx, buf, buf + bufsiz, &root);",
                  auStack_890);
          pcStack_9a8 = (code *)0x112af6;
          println((fb_output_t *)pcVar36,"if (ctx->error) {");
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + 1;
          pcStack_9a8 = (code *)0x112b0d;
          println((fb_output_t *)pcVar36,"return ctx->error;");
          if (((fb_output_t *)pcVar36)->indent == 0) {
            pcStack_9a8 = (code *)0x11306f;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x68f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar36)->indent = ((fb_output_t *)pcVar36)->indent + -1;
          pcStack_9a8 = (code *)0x112b34;
          println((fb_output_t *)pcVar36,"}");
          pcStack_9a8 = (code *)0x112b45;
          println((fb_output_t *)pcVar36,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
          pcStack_9a8 = (code *)0x112b56;
          println((fb_output_t *)pcVar36,"ctx->end_loc = buf;");
          pcStack_9a8 = (code *)0x112b67;
          println((fb_output_t *)pcVar36,"return 0;");
          iVar10 = ((fb_output_t *)pcVar36)->indent;
          if (iVar10 == 0) {
            pcStack_9a8 = (code *)0x112b94;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x693,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
        }
        ((fb_output_t *)pcVar36)->indent = iVar10 + -1;
        pcStack_9a8 = (code *)0x112c67;
        println((fb_output_t *)pcVar36,"}");
        pcStack_9a8 = (code *)0x112c78;
        println((fb_output_t *)pcVar36,"");
      }
LAB_00112c78:
      if (((fb_output_t *)pcVar36)->opts->cgen_pragmas != 0) {
        pcStack_9a8 = (code *)0x112ca5;
        fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)((fb_output_t *)pcVar36)->fp
              );
      }
      pcStack_9a8 = (code *)0x112cc4;
      println((fb_output_t *)pcVar36,"#endif /* %s_JSON_PARSER_H */",
              ((fb_output_t *)pcVar36)->S->basenameup);
      return 0;
    }
  }
  pcStack_9a8 = (code *)0x112fb5;
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x711,"int gen_json_parser_prototypes(fb_output_t *)");
}

Assistant:

static int gen_builder_struct_field_assign(fb_output_t *out, fb_compound_type_t *ct, int index, int arg_count,
        int conversion, int from_ptr)
{
    const char *nsc = out->nsc;
    fb_member_t *member;
    fb_symbol_t *sym;
    int n, len;
    const char *s;
    int deprecated_index = 0;
    const char *kind, *tprefix;
    fb_scoped_name_t snref;

    fb_clear(snref);
    switch (conversion) {
    case convert_to_pe: kind = "_to_pe"; break;
    case convert_from_pe: kind = "_from_pe"; break;
    default: kind = ""; break;
    }
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &n, &s);

        if (index > 0) {
            if (index % 4 == 0) {
                fprintf(out->fp, ";\n  ");
            } else {
                fprintf(out->fp, "; ");
            }
        }
        switch (member->type.type) {
        case vt_fixed_array_compound_type_ref:
            len = (int)member->type.len;
            fb_compound_name(member->type.ct, &snref);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        snref.text, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, v%i, %d)",
                        snref.text, kind, n, s, index, len);
            }
            ++index;
            continue;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snref);
            if (member->type.ct->symbol.kind == fb_is_struct) {
                if (member->metadata_flags & fb_f_deprecated) {
                    fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                            nsc, deprecated_index);
                    deprecated_index++;
                    index += get_total_struct_field_count(member->type.ct);
                    continue;
                }
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy%s(&p->%.*s, &p2->%.*s)", snref.text, kind, n, s, n, s);
                    /* `index` does not count children, but it doesn't matter here. */
                    ++index;
                } else {
                    fprintf(out->fp, "%s_assign%s(&p->%.*s", snref.text, kind, n, s);
                    index = gen_builder_struct_call_list(out, member->type.ct, index, arg_count, 0);
                    fprintf(out->fp, ")");
                }
                continue;
            }
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_from_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_to_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            continue;
        case vt_fixed_array_type:
            tprefix = scalar_type_prefix(member->type.st);
            len = (int)member->type.len;
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        nsc, tprefix, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, v%i, %d)",
                        nsc, tprefix, kind, n, s, index, len);
            }
            ++index;
            break;
        case vt_scalar_type:
            tprefix = scalar_type_prefix(member->type.st);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_from_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_to_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            break;
        default:
            gen_panic(out, "internal error: type error");
            continue;
        }
    }
    if (arg_count > 0) {
        fprintf(out->fp, ";\n  ");
    }
    return index;
}